

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  long lVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  byte bVar81;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  long lVar82;
  uint uVar83;
  ulong uVar84;
  bool bVar85;
  float fVar86;
  float fVar132;
  float fVar134;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar93 [16];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar140;
  undefined4 uVar141;
  undefined8 uVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  float fVar153;
  float fVar154;
  float fVar161;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar162;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [8];
  int iStack_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int iStack_968;
  int iStack_964;
  undefined1 local_950 [16];
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined8 uStack_938;
  ulong local_930;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  long local_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 uStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar9 = prim[1];
  uVar78 = (ulong)(byte)PVar9;
  lVar70 = uVar78 * 0x19;
  fVar162 = *(float *)(prim + lVar70 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar91 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar92 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + lVar70 + 6));
  fVar153 = fVar162 * auVar92._0_4_;
  fVar140 = fVar162 * auVar91._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar20);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar90);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar99 = vpmovsxbd_avx2(auVar89);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar110 = vpmovsxbd_avx2(auVar87);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar109 = vpmovsxbd_avx2(auVar5);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar78 + 6);
  auVar108 = vpmovsxbd_avx2(auVar6);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar84 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar84 + 6);
  auVar101 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar84 + uVar78 + 6);
  auVar106 = vpmovsxbd_avx2(auVar8);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102 = vcvtdq2ps_avx(auVar106);
  uVar80 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar96 = vpmovsxbd_avx2(auVar88);
  auVar107 = vcvtdq2ps_avx(auVar96);
  auVar184._4_4_ = fVar140;
  auVar184._0_4_ = fVar140;
  auVar184._8_4_ = fVar140;
  auVar184._12_4_ = fVar140;
  auVar184._16_4_ = fVar140;
  auVar184._20_4_ = fVar140;
  auVar184._24_4_ = fVar140;
  auVar184._28_4_ = fVar140;
  auVar187._8_4_ = 1;
  auVar187._0_8_ = 0x100000001;
  auVar187._12_4_ = 1;
  auVar187._16_4_ = 1;
  auVar187._20_4_ = 1;
  auVar187._24_4_ = 1;
  auVar187._28_4_ = 1;
  auVar103 = ZEXT1632(CONCAT412(fVar162 * auVar91._12_4_,
                                CONCAT48(fVar162 * auVar91._8_4_,
                                         CONCAT44(fVar162 * auVar91._4_4_,fVar140))));
  auVar97 = vpermps_avx2(auVar187,auVar103);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = vpermps_avx512vl(auVar94,auVar103);
  fVar140 = auVar95._0_4_;
  fVar167 = auVar95._4_4_;
  auVar103._4_4_ = fVar167 * auVar99._4_4_;
  auVar103._0_4_ = fVar140 * auVar99._0_4_;
  fVar168 = auVar95._8_4_;
  auVar103._8_4_ = fVar168 * auVar99._8_4_;
  fVar169 = auVar95._12_4_;
  auVar103._12_4_ = fVar169 * auVar99._12_4_;
  fVar154 = auVar95._16_4_;
  auVar103._16_4_ = fVar154 * auVar99._16_4_;
  fVar161 = auVar95._20_4_;
  auVar103._20_4_ = fVar161 * auVar99._20_4_;
  fVar86 = auVar95._24_4_;
  auVar103._24_4_ = fVar86 * auVar99._24_4_;
  auVar103._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar108._4_4_ * fVar167;
  auVar106._0_4_ = auVar108._0_4_ * fVar140;
  auVar106._8_4_ = auVar108._8_4_ * fVar168;
  auVar106._12_4_ = auVar108._12_4_ * fVar169;
  auVar106._16_4_ = auVar108._16_4_ * fVar154;
  auVar106._20_4_ = auVar108._20_4_ * fVar161;
  auVar106._24_4_ = auVar108._24_4_ * fVar86;
  auVar106._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar107._4_4_ * fVar167;
  auVar96._0_4_ = auVar107._0_4_ * fVar140;
  auVar96._8_4_ = auVar107._8_4_ * fVar168;
  auVar96._12_4_ = auVar107._12_4_ * fVar169;
  auVar96._16_4_ = auVar107._16_4_ * fVar154;
  auVar96._20_4_ = auVar107._20_4_ * fVar161;
  auVar96._24_4_ = auVar107._24_4_ * fVar86;
  auVar96._28_4_ = auVar95._28_4_;
  auVar20 = vfmadd231ps_fma(auVar103,auVar97,auVar98);
  auVar90 = vfmadd231ps_fma(auVar106,auVar97,auVar109);
  auVar89 = vfmadd231ps_fma(auVar96,auVar102,auVar97);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar184,auVar100);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar184,auVar110);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar101,auVar184);
  auVar185._4_4_ = fVar153;
  auVar185._0_4_ = fVar153;
  auVar185._8_4_ = fVar153;
  auVar185._12_4_ = fVar153;
  auVar185._16_4_ = fVar153;
  auVar185._20_4_ = fVar153;
  auVar185._24_4_ = fVar153;
  auVar185._28_4_ = fVar153;
  auVar96 = ZEXT1632(CONCAT412(fVar162 * auVar92._12_4_,
                               CONCAT48(fVar162 * auVar92._8_4_,
                                        CONCAT44(fVar162 * auVar92._4_4_,fVar153))));
  auVar106 = vpermps_avx2(auVar187,auVar96);
  auVar96 = vpermps_avx512vl(auVar94,auVar96);
  auVar97 = vmulps_avx512vl(auVar96,auVar99);
  auVar105._0_4_ = auVar96._0_4_ * auVar108._0_4_;
  auVar105._4_4_ = auVar96._4_4_ * auVar108._4_4_;
  auVar105._8_4_ = auVar96._8_4_ * auVar108._8_4_;
  auVar105._12_4_ = auVar96._12_4_ * auVar108._12_4_;
  auVar105._16_4_ = auVar96._16_4_ * auVar108._16_4_;
  auVar105._20_4_ = auVar96._20_4_ * auVar108._20_4_;
  auVar105._24_4_ = auVar96._24_4_ * auVar108._24_4_;
  auVar105._28_4_ = 0;
  auVar108._4_4_ = auVar96._4_4_ * auVar107._4_4_;
  auVar108._0_4_ = auVar96._0_4_ * auVar107._0_4_;
  auVar108._8_4_ = auVar96._8_4_ * auVar107._8_4_;
  auVar108._12_4_ = auVar96._12_4_ * auVar107._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * auVar107._16_4_;
  auVar108._20_4_ = auVar96._20_4_ * auVar107._20_4_;
  auVar108._24_4_ = auVar96._24_4_ * auVar107._24_4_;
  auVar108._28_4_ = auVar99._28_4_;
  auVar98 = vfmadd231ps_avx512vl(auVar97,auVar106,auVar98);
  auVar87 = vfmadd231ps_fma(auVar105,auVar106,auVar109);
  auVar5 = vfmadd231ps_fma(auVar108,auVar106,auVar102);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar185,auVar100);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar185,auVar110);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar185,auVar101);
  auVar176._8_4_ = 0x7fffffff;
  auVar176._0_8_ = 0x7fffffff7fffffff;
  auVar176._12_4_ = 0x7fffffff;
  auVar176._16_4_ = 0x7fffffff;
  auVar176._20_4_ = 0x7fffffff;
  auVar176._24_4_ = 0x7fffffff;
  auVar176._28_4_ = 0x7fffffff;
  auVar100 = vandps_avx(ZEXT1632(auVar20),auVar176);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  uVar84 = vcmpps_avx512vl(auVar100,auVar122,1);
  bVar85 = (bool)((byte)uVar84 & 1);
  auVar97._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar20._0_4_;
  bVar85 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar20._4_4_;
  bVar85 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar20._8_4_;
  bVar85 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar20._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar90),auVar176);
  uVar84 = vcmpps_avx512vl(auVar100,auVar122,1);
  bVar85 = (bool)((byte)uVar84 & 1);
  auVar94._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._0_4_;
  bVar85 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._4_4_;
  bVar85 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._8_4_;
  bVar85 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar89),auVar176);
  uVar84 = vcmpps_avx512vl(auVar100,auVar122,1);
  bVar85 = (bool)((byte)uVar84 & 1);
  auVar100._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._0_4_;
  bVar85 = (bool)((byte)(uVar84 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._4_4_;
  bVar85 = (bool)((byte)(uVar84 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._8_4_;
  bVar85 = (bool)((byte)(uVar84 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar89._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar84 >> 7) * 0x219392ef;
  auVar99 = vrcp14ps_avx512vl(auVar97);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = &DAT_3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar174._16_4_ = 0x3f800000;
  auVar174._20_4_ = 0x3f800000;
  auVar174._24_4_ = 0x3f800000;
  auVar174._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar97,auVar99,auVar174);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar94);
  auVar90 = vfnmadd213ps_fma(auVar94,auVar99,auVar174);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar100);
  auVar89 = vfnmadd213ps_fma(auVar100,auVar99,auVar174);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar99,auVar99);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vsubps_avx512vl(auVar100,auVar98);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar101._4_4_ = auVar20._4_4_ * auVar99._4_4_;
  auVar101._0_4_ = auVar20._0_4_ * auVar99._0_4_;
  auVar101._8_4_ = auVar20._8_4_ * auVar99._8_4_;
  auVar101._12_4_ = auVar20._12_4_ * auVar99._12_4_;
  auVar101._16_4_ = auVar99._16_4_ * 0.0;
  auVar101._20_4_ = auVar99._20_4_ * 0.0;
  auVar101._24_4_ = auVar99._24_4_ * 0.0;
  auVar101._28_4_ = auVar99._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx512vl(auVar100,auVar98);
  auVar121._0_4_ = auVar20._0_4_ * auVar100._0_4_;
  auVar121._4_4_ = auVar20._4_4_ * auVar100._4_4_;
  auVar121._8_4_ = auVar20._8_4_ * auVar100._8_4_;
  auVar121._12_4_ = auVar20._12_4_ * auVar100._12_4_;
  auVar121._16_4_ = auVar100._16_4_ * 0.0;
  auVar121._20_4_ = auVar100._20_4_ * 0.0;
  auVar121._24_4_ = auVar100._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar78 * -2 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar87));
  auVar102._4_4_ = auVar90._4_4_ * auVar100._4_4_;
  auVar102._0_4_ = auVar90._0_4_ * auVar100._0_4_;
  auVar102._8_4_ = auVar90._8_4_ * auVar100._8_4_;
  auVar102._12_4_ = auVar90._12_4_ * auVar100._12_4_;
  auVar102._16_4_ = auVar100._16_4_ * 0.0;
  auVar102._20_4_ = auVar100._20_4_ * 0.0;
  auVar102._24_4_ = auVar100._24_4_ * 0.0;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar98);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar87));
  auVar104._0_4_ = auVar90._0_4_ * auVar100._0_4_;
  auVar104._4_4_ = auVar90._4_4_ * auVar100._4_4_;
  auVar104._8_4_ = auVar90._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar90._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 + uVar78 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar5));
  auVar107._4_4_ = auVar100._4_4_ * auVar89._4_4_;
  auVar107._0_4_ = auVar100._0_4_ * auVar89._0_4_;
  auVar107._8_4_ = auVar100._8_4_ * auVar89._8_4_;
  auVar107._12_4_ = auVar100._12_4_ * auVar89._12_4_;
  auVar107._16_4_ = auVar100._16_4_ * 0.0;
  auVar107._20_4_ = auVar100._20_4_ * 0.0;
  auVar107._24_4_ = auVar100._24_4_ * 0.0;
  auVar107._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar5));
  auVar95._0_4_ = auVar89._0_4_ * auVar100._0_4_;
  auVar95._4_4_ = auVar89._4_4_ * auVar100._4_4_;
  auVar95._8_4_ = auVar89._8_4_ * auVar100._8_4_;
  auVar95._12_4_ = auVar89._12_4_ * auVar100._12_4_;
  auVar95._16_4_ = auVar100._16_4_ * 0.0;
  auVar95._20_4_ = auVar100._20_4_ * 0.0;
  auVar95._24_4_ = auVar100._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar101,auVar121);
  auVar98 = vpminsd_avx2(auVar102,auVar104);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98 = vpminsd_avx2(auVar107,auVar95);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar99._4_4_ = uVar141;
  auVar99._0_4_ = uVar141;
  auVar99._8_4_ = uVar141;
  auVar99._12_4_ = uVar141;
  auVar99._16_4_ = uVar141;
  auVar99._20_4_ = uVar141;
  auVar99._24_4_ = uVar141;
  auVar99._28_4_ = uVar141;
  auVar98 = vmaxps_avx512vl(auVar98,auVar99);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar100,auVar98);
  auVar175 = ZEXT3264(local_320);
  auVar100 = vpmaxsd_avx2(auVar101,auVar121);
  auVar152 = ZEXT3264(auVar100);
  auVar98 = vpmaxsd_avx2(auVar102,auVar104);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar98 = vpmaxsd_avx2(auVar107,auVar95);
  uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar110._4_4_ = uVar141;
  auVar110._0_4_ = uVar141;
  auVar110._8_4_ = uVar141;
  auVar110._12_4_ = uVar141;
  auVar110._16_4_ = uVar141;
  auVar110._20_4_ = uVar141;
  auVar110._24_4_ = uVar141;
  auVar110._28_4_ = uVar141;
  auVar98 = vminps_avx512vl(auVar98,auVar110);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar109._8_4_ = 0x3f800003;
  auVar109._0_8_ = 0x3f8000033f800003;
  auVar109._12_4_ = 0x3f800003;
  auVar109._16_4_ = 0x3f800003;
  auVar109._20_4_ = 0x3f800003;
  auVar109._24_4_ = 0x3f800003;
  auVar109._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar109);
  auVar98 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar98,_DAT_0205a920);
  uVar142 = vcmpps_avx512vl(local_320,auVar100,2);
  bVar85 = (byte)((byte)uVar142 & (byte)uVar21) != 0;
  if (bVar85) {
    uVar84 = (ulong)(byte)((byte)uVar142 & (byte)uVar21);
    auVar150 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar150);
    do {
      auVar98 = auVar175._0_32_;
      auVar100 = auVar152._0_32_;
      local_820 = in_ZMM21._0_32_;
      local_800 = in_ZMM20._0_32_;
      lVar82 = 0;
      for (uVar78 = uVar84; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        lVar82 = lVar82 + 1;
      }
      uVar84 = uVar84 - 1 & uVar84;
      uVar78 = (ulong)(uint)((int)lVar82 << 6);
      uVar83 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar83].ptr;
      auVar20 = *(undefined1 (*) [16])(prim + uVar78 + lVar70 + 0x16);
      if (uVar84 != 0) {
        uVar79 = uVar84 - 1 & uVar84;
        for (uVar80 = uVar84; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        }
        if (uVar79 != 0) {
          for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_770 = *(undefined1 (*) [16])(prim + uVar78 + lVar70 + 0x26);
      local_780 = *(undefined1 (*) [16])(prim + uVar78 + lVar70 + 0x36);
      local_790 = *(undefined1 (*) [16])(prim + uVar78 + lVar70 + 0x46);
      local_840._0_8_ = pGVar11;
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar87 = vsubps_avx512vl(auVar20,auVar90);
      uVar141 = auVar87._0_4_;
      auVar91._4_4_ = uVar141;
      auVar91._0_4_ = uVar141;
      auVar91._8_4_ = uVar141;
      auVar91._12_4_ = uVar141;
      auVar89 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar162 = pre->ray_space[k].vz.field_0.m128[0];
      fVar140 = pre->ray_space[k].vz.field_0.m128[1];
      fVar167 = pre->ray_space[k].vz.field_0.m128[2];
      fVar168 = pre->ray_space[k].vz.field_0.m128[3];
      auVar93._0_4_ = fVar162 * auVar87._0_4_;
      auVar93._4_4_ = fVar140 * auVar87._4_4_;
      auVar93._8_4_ = fVar167 * auVar87._8_4_;
      auVar93._12_4_ = fVar168 * auVar87._12_4_;
      auVar89 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar4,auVar89);
      auVar5 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar3,auVar91);
      auVar88 = vshufps_avx512vl(auVar20,auVar20,0xff);
      auVar87 = vsubps_avx(local_770,auVar90);
      uVar141 = auVar87._0_4_;
      auVar155._4_4_ = uVar141;
      auVar155._0_4_ = uVar141;
      auVar155._8_4_ = uVar141;
      auVar155._12_4_ = uVar141;
      auVar89 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar179._0_4_ = fVar162 * auVar87._0_4_;
      auVar179._4_4_ = fVar140 * auVar87._4_4_;
      auVar179._8_4_ = fVar167 * auVar87._8_4_;
      auVar179._12_4_ = fVar168 * auVar87._12_4_;
      auVar89 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar4,auVar89);
      auVar6 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar3,auVar155);
      auVar87 = vsubps_avx512vl(local_780,auVar90);
      uVar141 = auVar87._0_4_;
      auVar156._4_4_ = uVar141;
      auVar156._0_4_ = uVar141;
      auVar156._8_4_ = uVar141;
      auVar156._12_4_ = uVar141;
      auVar89 = vshufps_avx(auVar87,auVar87,0x55);
      auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
      auVar181._0_4_ = fVar162 * auVar87._0_4_;
      auVar181._4_4_ = fVar140 * auVar87._4_4_;
      auVar181._8_4_ = fVar167 * auVar87._8_4_;
      auVar181._12_4_ = fVar168 * auVar87._12_4_;
      auVar89 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar4,auVar89);
      auVar87 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar3,auVar156);
      auVar89 = vsubps_avx512vl(local_790,auVar90);
      uVar141 = auVar89._0_4_;
      auVar92._4_4_ = uVar141;
      auVar92._0_4_ = uVar141;
      auVar92._8_4_ = uVar141;
      auVar92._12_4_ = uVar141;
      auVar90 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar182._0_4_ = fVar162 * auVar89._0_4_;
      auVar182._4_4_ = fVar140 * auVar89._4_4_;
      auVar182._8_4_ = fVar167 * auVar89._8_4_;
      auVar182._12_4_ = fVar168 * auVar89._12_4_;
      auVar90 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar4,auVar90);
      auVar7 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar92);
      lVar69 = (long)iVar10 * 0x44;
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar69);
      uVar141 = auVar5._0_4_;
      local_7c0._4_4_ = uVar141;
      local_7c0._0_4_ = uVar141;
      local_7c0._8_4_ = uVar141;
      local_7c0._12_4_ = uVar141;
      local_7c0._16_4_ = uVar141;
      local_7c0._20_4_ = uVar141;
      local_7c0._24_4_ = uVar141;
      local_7c0._28_4_ = uVar141;
      auVar151._8_4_ = 1;
      auVar151._0_8_ = 0x100000001;
      auVar151._12_4_ = 1;
      auVar151._16_4_ = 1;
      auVar151._20_4_ = 1;
      auVar151._24_4_ = 1;
      auVar151._28_4_ = 1;
      local_7e0 = vpermps_avx512vl(auVar151,ZEXT1632(auVar5));
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x484);
      local_900 = vbroadcastss_avx512vl(auVar6);
      local_580 = vpermps_avx2(auVar151,ZEXT1632(auVar6));
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x908);
      local_340 = vbroadcastss_avx512vl(auVar87);
      local_360 = vpermps_avx512vl(auVar151,ZEXT1632(auVar87));
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0xd8c);
      local_860 = vbroadcastss_avx512vl(auVar7);
      auVar150 = ZEXT3264(local_860);
      local_880 = vpermps_avx512vl(auVar151,ZEXT1632(auVar7));
      auVar101 = vmulps_avx512vl(local_860,auVar108);
      auVar102 = vmulps_avx512vl(local_880,auVar108);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_340);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_360);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,local_900);
      auVar90 = vfmadd231ps_fma(auVar102,auVar110,local_580);
      auVar97 = vfmadd231ps_avx512vl(auVar101,auVar99,local_7c0);
      auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar99,local_7e0);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar69);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x484);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x908);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0xd8c);
      auVar96 = vmulps_avx512vl(local_860,auVar106);
      auVar94 = vmulps_avx512vl(local_880,auVar106);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,local_340);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar107,local_360);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_900);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_580);
      auVar8 = vfmadd231ps_fma(auVar96,auVar101,local_7c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_7e0);
      local_920 = vsubps_avx512vl(ZEXT1632(auVar8),auVar97);
      _local_980 = vsubps_avx(auVar94,auVar103);
      auVar96 = vmulps_avx512vl(auVar103,local_920);
      auVar95 = vmulps_avx512vl(auVar97,_local_980);
      auVar96 = vsubps_avx512vl(auVar96,auVar95);
      auVar90 = vshufps_avx(local_770,local_770,0xff);
      uVar142 = auVar88._0_8_;
      local_380._8_8_ = uVar142;
      local_380._0_8_ = uVar142;
      local_380._16_8_ = uVar142;
      local_380._24_8_ = uVar142;
      local_3a0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(local_780,local_780,0xff);
      local_3c0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx512vl(local_790,local_790,0xff);
      uVar142 = auVar90._0_8_;
      register0x00001248 = uVar142;
      local_3e0 = uVar142;
      register0x00001250 = uVar142;
      register0x00001258 = uVar142;
      auVar95 = vmulps_avx512vl(_local_3e0,auVar108);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_3c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar110,local_3a0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,local_380);
      auVar104 = vmulps_avx512vl(_local_3e0,auVar106);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_3c0);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,local_3a0);
      auVar88 = vfmadd231ps_fma(auVar104,auVar101,local_380);
      auVar104 = vmulps_avx512vl(_local_980,_local_980);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_920,local_920);
      auVar105 = vmaxps_avx512vl(auVar95,ZEXT1632(auVar88));
      auVar105 = vmulps_avx512vl(auVar105,auVar105);
      auVar104 = vmulps_avx512vl(auVar105,auVar104);
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      uVar142 = vcmpps_avx512vl(auVar96,auVar104,2);
      auVar90 = vblendps_avx(auVar5,auVar20,8);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar89 = vandps_avx512vl(auVar90,auVar91);
      auVar90 = vblendps_avx(auVar6,local_770,8);
      auVar90 = vandps_avx512vl(auVar90,auVar91);
      auVar89 = vmaxps_avx(auVar89,auVar90);
      auVar90 = vblendps_avx(auVar87,local_780,8);
      auVar92 = vandps_avx512vl(auVar90,auVar91);
      auVar90 = vblendps_avx(auVar7,local_790,8);
      auVar90 = vandps_avx512vl(auVar90,auVar91);
      auVar90 = vmaxps_avx(auVar92,auVar90);
      auVar90 = vmaxps_avx(auVar89,auVar90);
      auVar89 = vmovshdup_avx(auVar90);
      auVar89 = vmaxss_avx(auVar89,auVar90);
      auVar90 = vshufpd_avx(auVar90,auVar90,1);
      auVar90 = vmaxss_avx(auVar90,auVar89);
      auVar89 = vcvtsi2ss_avx512f(local_790,iVar10);
      local_4c0._0_16_ = auVar89;
      auVar183._0_4_ = auVar89._0_4_;
      auVar183._4_4_ = auVar183._0_4_;
      auVar183._8_4_ = auVar183._0_4_;
      auVar183._12_4_ = auVar183._0_4_;
      auVar183._16_4_ = auVar183._0_4_;
      auVar183._20_4_ = auVar183._0_4_;
      auVar183._24_4_ = auVar183._0_4_;
      auVar183._28_4_ = auVar183._0_4_;
      uVar21 = vcmpps_avx512vl(auVar183,_DAT_02020f40,0xe);
      local_670 = (byte)uVar142 & (byte)uVar21;
      local_8a0 = auVar90._0_4_ * 4.7683716e-07;
      auVar159._8_4_ = 2;
      auVar159._0_8_ = 0x200000002;
      auVar159._12_4_ = 2;
      auVar159._16_4_ = 2;
      auVar159._20_4_ = 2;
      auVar159._24_4_ = 2;
      auVar159._28_4_ = 2;
      local_400 = vpermps_avx512vl(auVar159,ZEXT1632(auVar5));
      local_420 = vpermps_avx512vl(auVar159,ZEXT1632(auVar6));
      local_440 = vpermps_avx512vl(auVar159,ZEXT1632(auVar87));
      auVar96 = vpermps_avx2(auVar159,ZEXT1632(auVar7));
      fVar162 = *(float *)(ray + k * 4 + 0xc0);
      local_950 = ZEXT416((uint)local_8a0);
      if (local_670 == 0) {
        uVar78 = 0;
        auVar90 = vxorps_avx512vl(auVar20,auVar20);
        auVar193 = ZEXT1664(auVar90);
        auVar175 = ZEXT3264(auVar98);
        in_ZMM20 = ZEXT3264(local_800);
        auVar152 = ZEXT3264(auVar100);
        in_ZMM21 = ZEXT3264(local_820);
        auVar192 = ZEXT3264(local_7c0);
        auVar191 = ZEXT3264(local_7e0);
        auVar190 = ZEXT3264(local_900);
        auVar194 = ZEXT3264(local_880);
      }
      else {
        fStack_89c = 0.0;
        fStack_898 = 0.0;
        fStack_894 = 0.0;
        auVar106 = vmulps_avx512vl(auVar96,auVar106);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_440,auVar106);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_420,auVar107);
        auVar102 = vfmadd213ps_avx512vl(auVar101,local_400,auVar102);
        auVar108 = vmulps_avx512vl(auVar96,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_440,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar110,local_420,auVar109);
        auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1694);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1f9c);
        auVar107 = vfmadd213ps_avx512vl(auVar99,local_400,auVar107);
        auVar99 = vmulps_avx512vl(local_860,auVar101);
        auVar106 = vmulps_avx512vl(local_880,auVar101);
        auVar31._4_4_ = auVar96._4_4_ * auVar101._4_4_;
        auVar31._0_4_ = auVar96._0_4_ * auVar101._0_4_;
        auVar31._8_4_ = auVar96._8_4_ * auVar101._8_4_;
        auVar31._12_4_ = auVar96._12_4_ * auVar101._12_4_;
        auVar31._16_4_ = auVar96._16_4_ * auVar101._16_4_;
        auVar31._20_4_ = auVar96._20_4_ * auVar101._20_4_;
        auVar31._24_4_ = auVar96._24_4_ * auVar101._24_4_;
        auVar31._28_4_ = auVar101._28_4_;
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar106,auVar108,local_360);
        auVar108 = vfmadd231ps_avx512vl(auVar31,local_440,auVar108);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,local_900);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_580);
        auVar106 = vfmadd231ps_avx512vl(auVar108,local_420,auVar109);
        auVar104 = vfmadd231ps_avx512vl(auVar99,auVar110,local_7c0);
        auVar191 = ZEXT3264(local_7e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,local_7e0);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1f9c);
        auVar106 = vfmadd231ps_avx512vl(auVar106,local_400,auVar110);
        auVar110 = vmulps_avx512vl(local_860,auVar108);
        auVar105 = vmulps_avx512vl(local_880,auVar108);
        auVar32._4_4_ = auVar96._4_4_ * auVar108._4_4_;
        auVar32._0_4_ = auVar96._0_4_ * auVar108._0_4_;
        auVar32._8_4_ = auVar96._8_4_ * auVar108._8_4_;
        auVar32._12_4_ = auVar96._12_4_ * auVar108._12_4_;
        auVar32._16_4_ = auVar96._16_4_ * auVar108._16_4_;
        auVar32._20_4_ = auVar96._20_4_ * auVar108._20_4_;
        auVar32._24_4_ = auVar96._24_4_ * auVar108._24_4_;
        auVar32._28_4_ = auVar108._28_4_;
        auVar108 = vfmadd231ps_avx512vl(auVar110,auVar109,local_340);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,local_360);
        auVar109 = vfmadd231ps_avx512vl(auVar32,local_440,auVar109);
        auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1694);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,local_900);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_580);
        auVar110 = vfmadd231ps_avx512vl(auVar109,local_420,auVar110);
        auVar109 = vfmadd231ps_avx512vl(auVar108,auVar99,local_7c0);
        auVar108 = vfmadd231ps_avx512vl(auVar105,auVar99,local_7e0);
        auVar105 = vfmadd231ps_avx512vl(auVar110,local_400,auVar99);
        auVar188._8_4_ = 0x7fffffff;
        auVar188._0_8_ = 0x7fffffff7fffffff;
        auVar188._12_4_ = 0x7fffffff;
        auVar188._16_4_ = 0x7fffffff;
        auVar188._20_4_ = 0x7fffffff;
        auVar188._24_4_ = 0x7fffffff;
        auVar188._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(auVar104,auVar188);
        auVar110 = vandps_avx(auVar101,auVar188);
        auVar110 = vmaxps_avx(auVar99,auVar110);
        auVar99 = vandps_avx(auVar106,auVar188);
        auVar99 = vmaxps_avx(auVar110,auVar99);
        auVar106 = vbroadcastss_avx512vl(local_950);
        uVar78 = vcmpps_avx512vl(auVar99,auVar106,1);
        bVar13 = (bool)((byte)uVar78 & 1);
        auVar111._0_4_ = (float)((uint)bVar13 * local_920._0_4_ | (uint)!bVar13 * auVar104._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar13 * local_920._4_4_ | (uint)!bVar13 * auVar104._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar13 * local_920._8_4_ | (uint)!bVar13 * auVar104._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar13 * local_920._12_4_ | (uint)!bVar13 * auVar104._12_4_)
        ;
        bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar13 * local_920._16_4_ | (uint)!bVar13 * auVar104._16_4_)
        ;
        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar13 * local_920._20_4_ | (uint)!bVar13 * auVar104._20_4_)
        ;
        bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar13 * local_920._24_4_ | (uint)!bVar13 * auVar104._24_4_)
        ;
        bVar13 = SUB81(uVar78 >> 7,0);
        auVar111._28_4_ = (uint)bVar13 * local_920._28_4_ | (uint)!bVar13 * auVar104._28_4_;
        bVar13 = (bool)((byte)uVar78 & 1);
        auVar112._0_4_ = (float)((uint)bVar13 * local_980._0_4_ | (uint)!bVar13 * auVar101._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar13 * local_980._4_4_ | (uint)!bVar13 * auVar101._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar13 * iStack_978 | (uint)!bVar13 * auVar101._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar13 * iStack_974 | (uint)!bVar13 * auVar101._12_4_);
        bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar13 * iStack_970 | (uint)!bVar13 * auVar101._16_4_);
        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar13 * iStack_96c | (uint)!bVar13 * auVar101._20_4_);
        bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar13 * iStack_968 | (uint)!bVar13 * auVar101._24_4_);
        bVar13 = SUB81(uVar78 >> 7,0);
        auVar112._28_4_ = (uint)bVar13 * iStack_964 | (uint)!bVar13 * auVar101._28_4_;
        auVar99 = vandps_avx(auVar188,auVar109);
        auVar110 = vandps_avx(auVar108,auVar188);
        auVar110 = vmaxps_avx(auVar99,auVar110);
        auVar99 = vandps_avx(auVar105,auVar188);
        auVar99 = vmaxps_avx(auVar110,auVar99);
        uVar78 = vcmpps_avx512vl(auVar99,auVar106,1);
        bVar13 = (bool)((byte)uVar78 & 1);
        auVar113._0_4_ = (float)((uint)bVar13 * local_920._0_4_ | (uint)!bVar13 * auVar109._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * local_920._4_4_ | (uint)!bVar13 * auVar109._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * local_920._8_4_ | (uint)!bVar13 * auVar109._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * local_920._12_4_ | (uint)!bVar13 * auVar109._12_4_)
        ;
        bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar13 * local_920._16_4_ | (uint)!bVar13 * auVar109._16_4_)
        ;
        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar13 * local_920._20_4_ | (uint)!bVar13 * auVar109._20_4_)
        ;
        bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar13 * local_920._24_4_ | (uint)!bVar13 * auVar109._24_4_)
        ;
        bVar13 = SUB81(uVar78 >> 7,0);
        auVar113._28_4_ = (uint)bVar13 * local_920._28_4_ | (uint)!bVar13 * auVar109._28_4_;
        bVar13 = (bool)((byte)uVar78 & 1);
        auVar114._0_4_ = (float)((uint)bVar13 * local_980._0_4_ | (uint)!bVar13 * auVar108._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar13 * local_980._4_4_ | (uint)!bVar13 * auVar108._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar13 * iStack_978 | (uint)!bVar13 * auVar108._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar13 * iStack_974 | (uint)!bVar13 * auVar108._12_4_);
        bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar13 * iStack_970 | (uint)!bVar13 * auVar108._16_4_);
        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar13 * iStack_96c | (uint)!bVar13 * auVar108._20_4_);
        bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar13 * iStack_968 | (uint)!bVar13 * auVar108._24_4_);
        bVar13 = SUB81(uVar78 >> 7,0);
        auVar114._28_4_ = (uint)bVar13 * iStack_964 | (uint)!bVar13 * auVar108._28_4_;
        auVar93 = vxorps_avx512vl(auVar20,auVar20);
        auVar193 = ZEXT1664(auVar93);
        auVar99 = vfmadd213ps_avx512vl(auVar111,auVar111,ZEXT1632(auVar93));
        auVar90 = vfmadd231ps_fma(auVar99,auVar112,auVar112);
        auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar140 = auVar99._0_4_;
        fVar167 = auVar99._4_4_;
        fVar168 = auVar99._8_4_;
        fVar169 = auVar99._12_4_;
        fVar154 = auVar99._16_4_;
        fVar161 = auVar99._20_4_;
        fVar86 = auVar99._24_4_;
        auVar33._4_4_ = fVar167 * fVar167 * fVar167 * auVar90._4_4_ * -0.5;
        auVar33._0_4_ = fVar140 * fVar140 * fVar140 * auVar90._0_4_ * -0.5;
        auVar33._8_4_ = fVar168 * fVar168 * fVar168 * auVar90._8_4_ * -0.5;
        auVar33._12_4_ = fVar169 * fVar169 * fVar169 * auVar90._12_4_ * -0.5;
        auVar33._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar33._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar33._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar33._28_4_ = 0;
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar109 = vfmadd231ps_avx512vl(auVar33,auVar110,auVar99);
        auVar34._4_4_ = auVar112._4_4_ * auVar109._4_4_;
        auVar34._0_4_ = auVar112._0_4_ * auVar109._0_4_;
        auVar34._8_4_ = auVar112._8_4_ * auVar109._8_4_;
        auVar34._12_4_ = auVar112._12_4_ * auVar109._12_4_;
        auVar34._16_4_ = auVar112._16_4_ * auVar109._16_4_;
        auVar34._20_4_ = auVar112._20_4_ * auVar109._20_4_;
        auVar34._24_4_ = auVar112._24_4_ * auVar109._24_4_;
        auVar34._28_4_ = auVar99._28_4_;
        auVar35._4_4_ = auVar109._4_4_ * -auVar111._4_4_;
        auVar35._0_4_ = auVar109._0_4_ * -auVar111._0_4_;
        auVar35._8_4_ = auVar109._8_4_ * -auVar111._8_4_;
        auVar35._12_4_ = auVar109._12_4_ * -auVar111._12_4_;
        auVar35._16_4_ = auVar109._16_4_ * -auVar111._16_4_;
        auVar35._20_4_ = auVar109._20_4_ * -auVar111._20_4_;
        auVar35._24_4_ = auVar109._24_4_ * -auVar111._24_4_;
        auVar35._28_4_ = auVar111._28_4_ ^ 0x80000000;
        auVar99 = vmulps_avx512vl(auVar109,ZEXT1632(auVar93));
        auVar104 = ZEXT1632(auVar93);
        auVar108 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar104);
        auVar90 = vfmadd231ps_fma(auVar108,auVar114,auVar114);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        fVar140 = auVar108._0_4_;
        fVar167 = auVar108._4_4_;
        fVar168 = auVar108._8_4_;
        fVar169 = auVar108._12_4_;
        fVar154 = auVar108._16_4_;
        fVar161 = auVar108._20_4_;
        fVar86 = auVar108._24_4_;
        auVar36._4_4_ = fVar167 * fVar167 * fVar167 * auVar90._4_4_ * -0.5;
        auVar36._0_4_ = fVar140 * fVar140 * fVar140 * auVar90._0_4_ * -0.5;
        auVar36._8_4_ = fVar168 * fVar168 * fVar168 * auVar90._8_4_ * -0.5;
        auVar36._12_4_ = fVar169 * fVar169 * fVar169 * auVar90._12_4_ * -0.5;
        auVar36._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar36._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar36._24_4_ = fVar86 * fVar86 * fVar86 * -0.0;
        auVar36._28_4_ = 0;
        auVar110 = vfmadd231ps_avx512vl(auVar36,auVar110,auVar108);
        auVar37._4_4_ = auVar114._4_4_ * auVar110._4_4_;
        auVar37._0_4_ = auVar114._0_4_ * auVar110._0_4_;
        auVar37._8_4_ = auVar114._8_4_ * auVar110._8_4_;
        auVar37._12_4_ = auVar114._12_4_ * auVar110._12_4_;
        auVar37._16_4_ = auVar114._16_4_ * auVar110._16_4_;
        auVar37._20_4_ = auVar114._20_4_ * auVar110._20_4_;
        auVar37._24_4_ = auVar114._24_4_ * auVar110._24_4_;
        auVar37._28_4_ = auVar108._28_4_;
        auVar38._4_4_ = -auVar113._4_4_ * auVar110._4_4_;
        auVar38._0_4_ = -auVar113._0_4_ * auVar110._0_4_;
        auVar38._8_4_ = -auVar113._8_4_ * auVar110._8_4_;
        auVar38._12_4_ = -auVar113._12_4_ * auVar110._12_4_;
        auVar38._16_4_ = -auVar113._16_4_ * auVar110._16_4_;
        auVar38._20_4_ = -auVar113._20_4_ * auVar110._20_4_;
        auVar38._24_4_ = -auVar113._24_4_ * auVar110._24_4_;
        auVar38._28_4_ = auVar109._28_4_;
        auVar110 = vmulps_avx512vl(auVar110,auVar104);
        auVar90 = vfmadd213ps_fma(auVar34,auVar95,auVar97);
        auVar89 = vfmadd213ps_fma(auVar35,auVar95,auVar103);
        auVar109 = vfmadd213ps_avx512vl(auVar99,auVar95,auVar107);
        auVar108 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar88),ZEXT1632(auVar8));
        auVar91 = vfnmadd213ps_fma(auVar34,auVar95,auVar97);
        auVar106 = ZEXT1632(auVar88);
        auVar87 = vfmadd213ps_fma(auVar38,auVar106,auVar94);
        auVar92 = vfnmadd213ps_fma(auVar35,auVar95,auVar103);
        auVar5 = vfmadd213ps_fma(auVar110,auVar106,auVar102);
        auVar101 = vfnmadd231ps_avx512vl(auVar107,auVar95,auVar99);
        auVar8 = vfnmadd213ps_fma(auVar37,auVar106,ZEXT1632(auVar8));
        auVar155 = vfnmadd213ps_fma(auVar38,auVar106,auVar94);
        auVar156 = vfnmadd231ps_fma(auVar102,ZEXT1632(auVar88),auVar110);
        auVar110 = vsubps_avx512vl(auVar108,ZEXT1632(auVar91));
        auVar99 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar92));
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar5),auVar101);
        auVar107 = vmulps_avx512vl(auVar99,auVar101);
        auVar6 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar92),auVar102);
        auVar39._4_4_ = auVar91._4_4_ * auVar102._4_4_;
        auVar39._0_4_ = auVar91._0_4_ * auVar102._0_4_;
        auVar39._8_4_ = auVar91._8_4_ * auVar102._8_4_;
        auVar39._12_4_ = auVar91._12_4_ * auVar102._12_4_;
        auVar39._16_4_ = auVar102._16_4_ * 0.0;
        auVar39._20_4_ = auVar102._20_4_ * 0.0;
        auVar39._24_4_ = auVar102._24_4_ * 0.0;
        auVar39._28_4_ = auVar102._28_4_;
        auVar102 = vfmsub231ps_avx512vl(auVar39,auVar101,auVar110);
        auVar40._4_4_ = auVar92._4_4_ * auVar110._4_4_;
        auVar40._0_4_ = auVar92._0_4_ * auVar110._0_4_;
        auVar40._8_4_ = auVar92._8_4_ * auVar110._8_4_;
        auVar40._12_4_ = auVar92._12_4_ * auVar110._12_4_;
        auVar40._16_4_ = auVar110._16_4_ * 0.0;
        auVar40._20_4_ = auVar110._20_4_ * 0.0;
        auVar40._24_4_ = auVar110._24_4_ * 0.0;
        auVar40._28_4_ = auVar110._28_4_;
        auVar7 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar91),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar104,auVar102);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,ZEXT1632(auVar6));
        auVar104 = ZEXT1632(auVar93);
        uVar78 = vcmpps_avx512vl(auVar99,auVar104,2);
        bVar81 = (byte)uVar78;
        fVar86 = (float)((uint)(bVar81 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar8._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar132 = (float)((uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar8._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar134 = (float)((uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar8._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar136 = (float)((uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar8._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar86))));
        fVar153 = (float)((uint)(bVar81 & 1) * auVar89._0_4_ |
                         (uint)!(bool)(bVar81 & 1) * auVar155._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar133 = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar155._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar135 = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar155._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar137 = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar155._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar135,CONCAT44(fVar133,fVar153))));
        auVar115._0_4_ =
             (float)((uint)(bVar81 & 1) * auVar109._0_4_ |
                    (uint)!(bool)(bVar81 & 1) * auVar156._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar156._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar156._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar156._12_4_);
        fVar140 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar109._16_4_);
        auVar115._16_4_ = fVar140;
        fVar167 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar109._20_4_);
        auVar115._20_4_ = fVar167;
        fVar168 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar109._24_4_);
        auVar115._24_4_ = fVar168;
        iVar1 = (uint)(byte)(uVar78 >> 7) * auVar109._28_4_;
        auVar115._28_4_ = iVar1;
        auVar110 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar108);
        auVar116._0_4_ =
             (uint)(bVar81 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar6._0_4_;
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar6._4_4_;
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar6._8_4_;
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar6._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar110._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar110._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar110._24_4_;
        auVar116._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar110._28_4_;
        auVar110 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar87));
        auVar117._0_4_ =
             (float)((uint)(bVar81 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar89._0_4_
                    );
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar89._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar89._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar89._12_4_);
        fVar169 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar110._16_4_);
        auVar117._16_4_ = fVar169;
        fVar154 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar110._20_4_);
        auVar117._20_4_ = fVar154;
        fVar161 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar110._24_4_);
        auVar117._24_4_ = fVar161;
        auVar117._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar110._28_4_;
        auVar110 = vblendmps_avx512vl(auVar101,ZEXT1632(auVar5));
        auVar118._0_4_ =
             (float)((uint)(bVar81 & 1) * auVar110._0_4_ |
                    (uint)!(bool)(bVar81 & 1) * auVar109._0_4_);
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar109._4_4_);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar109._8_4_);
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar109._12_4_);
        bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar13 * auVar110._16_4_ | (uint)!bVar13 * auVar109._16_4_);
        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar13 * auVar110._20_4_ | (uint)!bVar13 * auVar109._20_4_);
        bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar13 * auVar110._24_4_ | (uint)!bVar13 * auVar109._24_4_);
        bVar13 = SUB81(uVar78 >> 7,0);
        auVar118._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar109._28_4_;
        auVar119._0_4_ =
             (uint)(bVar81 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar108._0_4_;
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar13 * (int)auVar91._4_4_ | (uint)!bVar13 * auVar108._4_4_;
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar13 * (int)auVar91._8_4_ | (uint)!bVar13 * auVar108._8_4_;
        bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar13 * (int)auVar91._12_4_ | (uint)!bVar13 * auVar108._12_4_;
        auVar119._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar108._16_4_;
        auVar119._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar108._20_4_;
        auVar119._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar108._24_4_;
        auVar119._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar108._28_4_;
        bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar120._0_4_ =
             (uint)(bVar81 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar5._0_4_;
        bVar14 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar14 * auVar101._4_4_ | (uint)!bVar14 * auVar5._4_4_;
        bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * auVar5._8_4_;
        bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar14 * auVar101._12_4_ | (uint)!bVar14 * auVar5._12_4_;
        auVar120._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_;
        auVar120._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_;
        auVar120._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_;
        iVar2 = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
        auVar120._28_4_ = iVar2;
        auVar97 = vsubps_avx512vl(auVar119,auVar107);
        auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar92._12_4_ |
                                                 (uint)!bVar16 * auVar87._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar92._8_4_ |
                                                          (uint)!bVar15 * auVar87._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar92._4_4_
                                                                   | (uint)!bVar13 * auVar87._4_4_,
                                                                   (uint)(bVar81 & 1) *
                                                                   (int)auVar92._0_4_ |
                                                                   (uint)!(bool)(bVar81 & 1) *
                                                                   auVar87._0_4_)))),auVar106);
        auVar109 = vsubps_avx(auVar120,auVar115);
        auVar108 = vsubps_avx(auVar107,auVar116);
        auVar101 = vsubps_avx(auVar106,auVar117);
        auVar102 = vsubps_avx(auVar115,auVar118);
        auVar41._4_4_ = auVar109._4_4_ * fVar132;
        auVar41._0_4_ = auVar109._0_4_ * fVar86;
        auVar41._8_4_ = auVar109._8_4_ * fVar134;
        auVar41._12_4_ = auVar109._12_4_ * fVar136;
        auVar41._16_4_ = auVar109._16_4_ * 0.0;
        auVar41._20_4_ = auVar109._20_4_ * 0.0;
        auVar41._24_4_ = auVar109._24_4_ * 0.0;
        auVar41._28_4_ = iVar2;
        auVar90 = vfmsub231ps_fma(auVar41,auVar115,auVar97);
        auVar42._4_4_ = fVar133 * auVar97._4_4_;
        auVar42._0_4_ = fVar153 * auVar97._0_4_;
        auVar42._8_4_ = fVar135 * auVar97._8_4_;
        auVar42._12_4_ = fVar137 * auVar97._12_4_;
        auVar42._16_4_ = auVar97._16_4_ * 0.0;
        auVar42._20_4_ = auVar97._20_4_ * 0.0;
        auVar42._24_4_ = auVar97._24_4_ * 0.0;
        auVar42._28_4_ = auVar99._28_4_;
        auVar89 = vfmsub231ps_fma(auVar42,auVar107,auVar110);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar104,ZEXT1632(auVar90));
        auVar163._0_4_ = auVar110._0_4_ * auVar115._0_4_;
        auVar163._4_4_ = auVar110._4_4_ * auVar115._4_4_;
        auVar163._8_4_ = auVar110._8_4_ * auVar115._8_4_;
        auVar163._12_4_ = auVar110._12_4_ * auVar115._12_4_;
        auVar163._16_4_ = auVar110._16_4_ * fVar140;
        auVar163._20_4_ = auVar110._20_4_ * fVar167;
        auVar163._24_4_ = auVar110._24_4_ * fVar168;
        auVar163._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar163,auVar106,auVar109);
        auVar103 = vfmadd231ps_avx512vl(auVar99,auVar104,ZEXT1632(auVar90));
        auVar99 = vmulps_avx512vl(auVar102,auVar116);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar108,auVar118);
        auVar43._4_4_ = auVar101._4_4_ * auVar118._4_4_;
        auVar43._0_4_ = auVar101._0_4_ * auVar118._0_4_;
        auVar43._8_4_ = auVar101._8_4_ * auVar118._8_4_;
        auVar43._12_4_ = auVar101._12_4_ * auVar118._12_4_;
        auVar43._16_4_ = auVar101._16_4_ * auVar118._16_4_;
        auVar43._20_4_ = auVar101._20_4_ * auVar118._20_4_;
        auVar43._24_4_ = auVar101._24_4_ * auVar118._24_4_;
        auVar43._28_4_ = auVar118._28_4_;
        auVar90 = vfmsub231ps_fma(auVar43,auVar117,auVar102);
        auVar164._0_4_ = auVar117._0_4_ * auVar108._0_4_;
        auVar164._4_4_ = auVar117._4_4_ * auVar108._4_4_;
        auVar164._8_4_ = auVar117._8_4_ * auVar108._8_4_;
        auVar164._12_4_ = auVar117._12_4_ * auVar108._12_4_;
        auVar164._16_4_ = fVar169 * auVar108._16_4_;
        auVar164._20_4_ = fVar154 * auVar108._20_4_;
        auVar164._24_4_ = fVar161 * auVar108._24_4_;
        auVar164._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar164,auVar101,auVar116);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar104,auVar99);
        auVar94 = vfmadd231ps_avx512vl(auVar99,auVar104,ZEXT1632(auVar90));
        auVar99 = vmaxps_avx(auVar103,auVar94);
        uVar142 = vcmpps_avx512vl(auVar99,auVar104,2);
        local_670 = local_670 & (byte)uVar142;
        in_ZMM20 = ZEXT3264(local_800);
        in_ZMM21 = ZEXT3264(local_820);
        auVar192 = ZEXT3264(local_7c0);
        auVar190 = ZEXT3264(local_900);
        auVar186 = ZEXT1664(local_950);
        if (local_670 == 0) {
          local_670 = 0;
          auVar175 = ZEXT3264(auVar98);
          auVar152 = ZEXT3264(auVar100);
        }
        else {
          auVar44._4_4_ = auVar102._4_4_ * auVar110._4_4_;
          auVar44._0_4_ = auVar102._0_4_ * auVar110._0_4_;
          auVar44._8_4_ = auVar102._8_4_ * auVar110._8_4_;
          auVar44._12_4_ = auVar102._12_4_ * auVar110._12_4_;
          auVar44._16_4_ = auVar102._16_4_ * auVar110._16_4_;
          auVar44._20_4_ = auVar102._20_4_ * auVar110._20_4_;
          auVar44._24_4_ = auVar102._24_4_ * auVar110._24_4_;
          auVar44._28_4_ = auVar99._28_4_;
          auVar87 = vfmsub231ps_fma(auVar44,auVar101,auVar109);
          auVar45._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar45._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar45._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar45._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar45._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar45._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar45._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar45._28_4_ = auVar109._28_4_;
          auVar89 = vfmsub231ps_fma(auVar45,auVar97,auVar102);
          auVar46._4_4_ = auVar101._4_4_ * auVar97._4_4_;
          auVar46._0_4_ = auVar101._0_4_ * auVar97._0_4_;
          auVar46._8_4_ = auVar101._8_4_ * auVar97._8_4_;
          auVar46._12_4_ = auVar101._12_4_ * auVar97._12_4_;
          auVar46._16_4_ = auVar101._16_4_ * auVar97._16_4_;
          auVar46._20_4_ = auVar101._20_4_ * auVar97._20_4_;
          auVar46._24_4_ = auVar101._24_4_ * auVar97._24_4_;
          auVar46._28_4_ = auVar101._28_4_;
          auVar5 = vfmsub231ps_fma(auVar46,auVar108,auVar110);
          auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar89),ZEXT1632(auVar5));
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar87),auVar104);
          auVar110 = vrcp14ps_avx512vl(auVar99);
          auVar22._8_4_ = 0x3f800000;
          auVar22._0_8_ = &DAT_3f8000003f800000;
          auVar22._12_4_ = 0x3f800000;
          auVar22._16_4_ = 0x3f800000;
          auVar22._20_4_ = 0x3f800000;
          auVar22._24_4_ = 0x3f800000;
          auVar22._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar110,auVar99,auVar22);
          auVar90 = vfmadd132ps_fma(auVar109,auVar110,auVar110);
          auVar47._4_4_ = auVar5._4_4_ * auVar115._4_4_;
          auVar47._0_4_ = auVar5._0_4_ * auVar115._0_4_;
          auVar47._8_4_ = auVar5._8_4_ * auVar115._8_4_;
          auVar47._12_4_ = auVar5._12_4_ * auVar115._12_4_;
          auVar47._16_4_ = fVar140 * 0.0;
          auVar47._20_4_ = fVar167 * 0.0;
          auVar47._24_4_ = fVar168 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar89 = vfmadd231ps_fma(auVar47,auVar106,ZEXT1632(auVar89));
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar107,ZEXT1632(auVar87));
          fVar140 = auVar90._0_4_;
          fVar167 = auVar90._4_4_;
          fVar168 = auVar90._8_4_;
          fVar169 = auVar90._12_4_;
          auVar110 = ZEXT1632(CONCAT412(auVar89._12_4_ * fVar169,
                                        CONCAT48(auVar89._8_4_ * fVar168,
                                                 CONCAT44(auVar89._4_4_ * fVar167,
                                                          auVar89._0_4_ * fVar140))));
          auVar152 = ZEXT3264(auVar110);
          auVar177._4_4_ = fVar162;
          auVar177._0_4_ = fVar162;
          auVar177._8_4_ = fVar162;
          auVar177._12_4_ = fVar162;
          auVar177._16_4_ = fVar162;
          auVar177._20_4_ = fVar162;
          auVar177._24_4_ = fVar162;
          auVar177._28_4_ = fVar162;
          uVar142 = vcmpps_avx512vl(auVar177,auVar110,2);
          uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar23._4_4_ = uVar141;
          auVar23._0_4_ = uVar141;
          auVar23._8_4_ = uVar141;
          auVar23._12_4_ = uVar141;
          auVar23._16_4_ = uVar141;
          auVar23._20_4_ = uVar141;
          auVar23._24_4_ = uVar141;
          auVar23._28_4_ = uVar141;
          uVar21 = vcmpps_avx512vl(auVar110,auVar23,2);
          local_670 = (byte)uVar142 & (byte)uVar21 & local_670;
          if (local_670 == 0) {
            local_670 = 0;
            auVar175 = ZEXT3264(auVar98);
            auVar152 = ZEXT3264(auVar100);
          }
          else {
            uVar142 = vcmpps_avx512vl(auVar99,auVar104,4);
            if ((local_670 & (byte)uVar142) == 0) {
              local_670 = 0;
              auVar175 = ZEXT3264(auVar98);
              auVar152 = ZEXT3264(auVar100);
            }
            else {
              local_670 = local_670 & (byte)uVar142;
              fVar154 = auVar103._0_4_ * fVar140;
              fVar161 = auVar103._4_4_ * fVar167;
              auVar48._4_4_ = fVar161;
              auVar48._0_4_ = fVar154;
              fVar86 = auVar103._8_4_ * fVar168;
              auVar48._8_4_ = fVar86;
              fVar153 = auVar103._12_4_ * fVar169;
              auVar48._12_4_ = fVar153;
              fVar132 = auVar103._16_4_ * 0.0;
              auVar48._16_4_ = fVar132;
              fVar133 = auVar103._20_4_ * 0.0;
              auVar48._20_4_ = fVar133;
              fVar134 = auVar103._24_4_ * 0.0;
              auVar48._24_4_ = fVar134;
              auVar48._28_4_ = auVar103._28_4_;
              fVar140 = auVar94._0_4_ * fVar140;
              fVar167 = auVar94._4_4_ * fVar167;
              auVar49._4_4_ = fVar167;
              auVar49._0_4_ = fVar140;
              fVar168 = auVar94._8_4_ * fVar168;
              auVar49._8_4_ = fVar168;
              fVar169 = auVar94._12_4_ * fVar169;
              auVar49._12_4_ = fVar169;
              fVar135 = auVar94._16_4_ * 0.0;
              auVar49._16_4_ = fVar135;
              fVar136 = auVar94._20_4_ * 0.0;
              auVar49._20_4_ = fVar136;
              fVar137 = auVar94._24_4_ * 0.0;
              auVar49._24_4_ = fVar137;
              auVar49._28_4_ = auVar94._28_4_;
              auVar172._8_4_ = 0x3f800000;
              auVar172._0_8_ = &DAT_3f8000003f800000;
              auVar172._12_4_ = 0x3f800000;
              auVar172._16_4_ = 0x3f800000;
              auVar172._20_4_ = 0x3f800000;
              auVar172._24_4_ = 0x3f800000;
              auVar172._28_4_ = 0x3f800000;
              auVar100 = vsubps_avx(auVar172,auVar48);
              bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
              bVar19 = SUB81(uVar78 >> 7,0);
              auVar175 = ZEXT3264(CONCAT428((uint)bVar19 * auVar103._28_4_ |
                                            (uint)!bVar19 * auVar100._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar134 |
                                                      (uint)!bVar18 * auVar100._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar133 |
                                                                (uint)!bVar17 * auVar100._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar132 |
                                                                          (uint)!bVar16 *
                                                                          auVar100._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar153 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar100._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar86 |
                                                  (uint)!bVar14 * auVar100._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar161 |
                                                           (uint)!bVar13 * auVar100._4_4_,
                                                           (uint)(bVar81 & 1) * (int)fVar154 |
                                                           (uint)!(bool)(bVar81 & 1) *
                                                           auVar100._0_4_))))))));
              auVar100 = vsubps_avx(auVar172,auVar49);
              local_5a0._0_4_ =
                   (uint)(bVar81 & 1) * (int)fVar140 | (uint)!(bool)(bVar81 & 1) * auVar100._0_4_;
              bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
              local_5a0._4_4_ = (uint)bVar13 * (int)fVar167 | (uint)!bVar13 * auVar100._4_4_;
              bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
              local_5a0._8_4_ = (uint)bVar13 * (int)fVar168 | (uint)!bVar13 * auVar100._8_4_;
              bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
              local_5a0._12_4_ = (uint)bVar13 * (int)fVar169 | (uint)!bVar13 * auVar100._12_4_;
              bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
              local_5a0._16_4_ = (uint)bVar13 * (int)fVar135 | (uint)!bVar13 * auVar100._16_4_;
              bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
              local_5a0._20_4_ = (uint)bVar13 * (int)fVar136 | (uint)!bVar13 * auVar100._20_4_;
              bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
              local_5a0._24_4_ = (uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar100._24_4_;
              bVar13 = SUB81(uVar78 >> 7,0);
              local_5a0._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar100._28_4_;
            }
          }
        }
        auVar194 = ZEXT3264(local_880);
        auVar150 = ZEXT3264(local_860);
        auVar178 = ZEXT3264(auVar96);
        if (local_670 == 0) {
          uVar78 = 0;
        }
        else {
          auVar100 = vsubps_avx(ZEXT1632(auVar88),auVar95);
          auVar99 = auVar175._0_32_;
          auVar90 = vfmadd213ps_fma(auVar100,auVar99,auVar95);
          uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar24._4_4_ = uVar141;
          auVar24._0_4_ = uVar141;
          auVar24._8_4_ = uVar141;
          auVar24._12_4_ = uVar141;
          auVar24._16_4_ = uVar141;
          auVar24._20_4_ = uVar141;
          auVar24._24_4_ = uVar141;
          auVar24._28_4_ = uVar141;
          auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                        CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                 CONCAT44(auVar90._4_4_ +
                                                                          auVar90._4_4_,
                                                                          auVar90._0_4_ +
                                                                          auVar90._0_4_)))),auVar24)
          ;
          auVar98 = auVar152._0_32_;
          uVar142 = vcmpps_avx512vl(auVar98,auVar100,6);
          local_670 = local_670 & (byte)uVar142;
          if (local_670 == 0) {
            uVar78 = 0;
          }
          else {
            local_980._0_4_ = *(undefined4 *)(prim + lVar82 * 4 + 6);
            auVar147._8_4_ = 0xbf800000;
            auVar147._0_8_ = 0xbf800000bf800000;
            auVar147._12_4_ = 0xbf800000;
            auVar147._16_4_ = 0xbf800000;
            auVar147._20_4_ = 0xbf800000;
            auVar147._24_4_ = 0xbf800000;
            auVar147._28_4_ = 0xbf800000;
            auVar25._8_4_ = 0x40000000;
            auVar25._0_8_ = 0x4000000040000000;
            auVar25._12_4_ = 0x40000000;
            auVar25._16_4_ = 0x40000000;
            auVar25._20_4_ = 0x40000000;
            auVar25._24_4_ = 0x40000000;
            auVar25._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_5a0,auVar147,auVar25);
            local_5a0 = local_700;
            auVar100 = local_5a0;
            local_6c0 = 0;
            local_6a0 = local_770._0_8_;
            uStack_698 = local_770._8_8_;
            local_690 = local_780._0_8_;
            uStack_688 = local_780._8_8_;
            local_680 = local_790._0_8_;
            uStack_678 = local_790._8_8_;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
              uVar78 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar78 = CONCAT71((int7)((ulong)pGVar11 >> 8),1),
                    pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar140 = 1.0 / auVar183._0_4_;
              local_660[0] = fVar140 * (auVar175._0_4_ + 0.0);
              local_660[1] = fVar140 * (auVar175._4_4_ + 1.0);
              local_660[2] = fVar140 * (auVar175._8_4_ + 2.0);
              local_660[3] = fVar140 * (auVar175._12_4_ + 3.0);
              fStack_650 = fVar140 * (auVar175._16_4_ + 4.0);
              fStack_64c = fVar140 * (auVar175._20_4_ + 5.0);
              fStack_648 = fVar140 * (auVar175._24_4_ + 6.0);
              fStack_644 = auVar175._28_4_ + 7.0;
              local_5a0._0_8_ = local_700._0_8_;
              local_5a0._8_8_ = local_700._8_8_;
              local_5a0._16_8_ = local_700._16_8_;
              local_5a0._24_8_ = local_700._24_8_;
              local_640 = local_5a0._0_8_;
              uStack_638 = local_5a0._8_8_;
              uStack_630 = local_5a0._16_8_;
              uStack_628 = local_5a0._24_8_;
              local_620 = auVar98;
              lVar82 = 0;
              uVar80 = (ulong)local_670;
              for (uVar78 = uVar80; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
                lVar82 = lVar82 + 1;
              }
              auVar152 = vpbroadcastd_avx512f();
              local_500 = vmovdqa64_avx512f(auVar152);
              local_930 = local_770._0_8_;
              uStack_928 = local_770._8_8_;
              auVar152 = vpbroadcastd_avx512f();
              local_540 = vmovdqa64_avx512f(auVar152);
              local_940 = local_780._0_4_;
              uStack_93c = local_780._4_4_;
              uStack_938 = local_780._8_8_;
              local_8c0 = local_790._0_4_;
              fStack_8bc = local_790._4_4_;
              fStack_8b8 = local_790._8_4_;
              fStack_8b4 = local_790._12_4_;
              uVar78 = CONCAT71((int7)((ulong)lVar82 >> 8),1);
              local_8e0 = auVar96;
              local_8a0 = fVar162;
              local_720 = auVar99;
              local_6e0 = auVar98;
              local_6bc = iVar10;
              local_6b0 = auVar20;
              local_5a0 = auVar100;
              do {
                auVar87 = auVar193._0_16_;
                local_740 = (undefined4)uVar80;
                uStack_73c = (undefined4)(uVar80 >> 0x20);
                local_920._0_4_ = (int)uVar78;
                local_760 = *(float *)(ray + k * 4 + 0x200);
                local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[lVar82]));
                local_480._0_8_ = lVar82;
                local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)&local_640 + lVar82 * 4)));
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + lVar82 * 4);
                local_9b0.context = context->user;
                fVar169 = local_200._0_4_;
                fVar167 = 1.0 - fVar169;
                fVar140 = fVar167 * fVar167 * -3.0;
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167)),
                                          ZEXT416((uint)(fVar169 * fVar167)),ZEXT416(0xc0000000));
                auVar89 = vfmsub132ss_fma(ZEXT416((uint)(fVar169 * fVar167)),
                                          ZEXT416((uint)(fVar169 * fVar169)),ZEXT416(0x40000000));
                fVar167 = auVar90._0_4_ * 3.0;
                fVar168 = auVar89._0_4_ * 3.0;
                fVar169 = fVar169 * fVar169 * 3.0;
                auVar170._0_4_ = fVar169 * local_8c0;
                auVar170._4_4_ = fVar169 * fStack_8bc;
                auVar170._8_4_ = fVar169 * fStack_8b8;
                auVar170._12_4_ = fVar169 * fStack_8b4;
                auVar143._4_4_ = fVar168;
                auVar143._0_4_ = fVar168;
                auVar143._8_4_ = fVar168;
                auVar143._12_4_ = fVar168;
                auVar71._4_4_ = uStack_93c;
                auVar71._0_4_ = local_940;
                auVar71._8_8_ = uStack_938;
                auVar90 = vfmadd132ps_fma(auVar143,auVar170,auVar71);
                auVar157._4_4_ = fVar167;
                auVar157._0_4_ = fVar167;
                auVar157._8_4_ = fVar167;
                auVar157._12_4_ = fVar167;
                auVar72._8_8_ = uStack_928;
                auVar72._0_8_ = local_930;
                auVar90 = vfmadd132ps_fma(auVar157,auVar90,auVar72);
                auVar144._4_4_ = fVar140;
                auVar144._0_4_ = fVar140;
                auVar144._8_4_ = fVar140;
                auVar144._12_4_ = fVar140;
                auVar90 = vfmadd213ps_fma(auVar144,auVar20,auVar90);
                auVar152 = vbroadcastss_avx512f(auVar90);
                auVar175 = vbroadcastss_avx512f(ZEXT416(1));
                local_280 = vpermps_avx512f(auVar175,ZEXT1664(auVar90));
                auVar175 = vbroadcastss_avx512f(ZEXT416(2));
                local_240 = vpermps_avx512f(auVar175,ZEXT1664(auVar90));
                local_2c0[0] = (RTCHitN)auVar152[0];
                local_2c0[1] = (RTCHitN)auVar152[1];
                local_2c0[2] = (RTCHitN)auVar152[2];
                local_2c0[3] = (RTCHitN)auVar152[3];
                local_2c0[4] = (RTCHitN)auVar152[4];
                local_2c0[5] = (RTCHitN)auVar152[5];
                local_2c0[6] = (RTCHitN)auVar152[6];
                local_2c0[7] = (RTCHitN)auVar152[7];
                local_2c0[8] = (RTCHitN)auVar152[8];
                local_2c0[9] = (RTCHitN)auVar152[9];
                local_2c0[10] = (RTCHitN)auVar152[10];
                local_2c0[0xb] = (RTCHitN)auVar152[0xb];
                local_2c0[0xc] = (RTCHitN)auVar152[0xc];
                local_2c0[0xd] = (RTCHitN)auVar152[0xd];
                local_2c0[0xe] = (RTCHitN)auVar152[0xe];
                local_2c0[0xf] = (RTCHitN)auVar152[0xf];
                local_2c0[0x10] = (RTCHitN)auVar152[0x10];
                local_2c0[0x11] = (RTCHitN)auVar152[0x11];
                local_2c0[0x12] = (RTCHitN)auVar152[0x12];
                local_2c0[0x13] = (RTCHitN)auVar152[0x13];
                local_2c0[0x14] = (RTCHitN)auVar152[0x14];
                local_2c0[0x15] = (RTCHitN)auVar152[0x15];
                local_2c0[0x16] = (RTCHitN)auVar152[0x16];
                local_2c0[0x17] = (RTCHitN)auVar152[0x17];
                local_2c0[0x18] = (RTCHitN)auVar152[0x18];
                local_2c0[0x19] = (RTCHitN)auVar152[0x19];
                local_2c0[0x1a] = (RTCHitN)auVar152[0x1a];
                local_2c0[0x1b] = (RTCHitN)auVar152[0x1b];
                local_2c0[0x1c] = (RTCHitN)auVar152[0x1c];
                local_2c0[0x1d] = (RTCHitN)auVar152[0x1d];
                local_2c0[0x1e] = (RTCHitN)auVar152[0x1e];
                local_2c0[0x1f] = (RTCHitN)auVar152[0x1f];
                local_2c0[0x20] = (RTCHitN)auVar152[0x20];
                local_2c0[0x21] = (RTCHitN)auVar152[0x21];
                local_2c0[0x22] = (RTCHitN)auVar152[0x22];
                local_2c0[0x23] = (RTCHitN)auVar152[0x23];
                local_2c0[0x24] = (RTCHitN)auVar152[0x24];
                local_2c0[0x25] = (RTCHitN)auVar152[0x25];
                local_2c0[0x26] = (RTCHitN)auVar152[0x26];
                local_2c0[0x27] = (RTCHitN)auVar152[0x27];
                local_2c0[0x28] = (RTCHitN)auVar152[0x28];
                local_2c0[0x29] = (RTCHitN)auVar152[0x29];
                local_2c0[0x2a] = (RTCHitN)auVar152[0x2a];
                local_2c0[0x2b] = (RTCHitN)auVar152[0x2b];
                local_2c0[0x2c] = (RTCHitN)auVar152[0x2c];
                local_2c0[0x2d] = (RTCHitN)auVar152[0x2d];
                local_2c0[0x2e] = (RTCHitN)auVar152[0x2e];
                local_2c0[0x2f] = (RTCHitN)auVar152[0x2f];
                local_2c0[0x30] = (RTCHitN)auVar152[0x30];
                local_2c0[0x31] = (RTCHitN)auVar152[0x31];
                local_2c0[0x32] = (RTCHitN)auVar152[0x32];
                local_2c0[0x33] = (RTCHitN)auVar152[0x33];
                local_2c0[0x34] = (RTCHitN)auVar152[0x34];
                local_2c0[0x35] = (RTCHitN)auVar152[0x35];
                local_2c0[0x36] = (RTCHitN)auVar152[0x36];
                local_2c0[0x37] = (RTCHitN)auVar152[0x37];
                local_2c0[0x38] = (RTCHitN)auVar152[0x38];
                local_2c0[0x39] = (RTCHitN)auVar152[0x39];
                local_2c0[0x3a] = (RTCHitN)auVar152[0x3a];
                local_2c0[0x3b] = (RTCHitN)auVar152[0x3b];
                local_2c0[0x3c] = (RTCHitN)auVar152[0x3c];
                local_2c0[0x3d] = (RTCHitN)auVar152[0x3d];
                local_2c0[0x3e] = (RTCHitN)auVar152[0x3e];
                local_2c0[0x3f] = (RTCHitN)auVar152[0x3f];
                local_180 = local_540._0_8_;
                uStack_178 = local_540._8_8_;
                uStack_170 = local_540._16_8_;
                uStack_168 = local_540._24_8_;
                uStack_160 = local_540._32_8_;
                uStack_158 = local_540._40_8_;
                uStack_150 = local_540._48_8_;
                uStack_148 = local_540._56_8_;
                auVar152 = vmovdqa64_avx512f(local_500);
                local_140 = vmovdqa64_avx512f(auVar152);
                vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                local_100 = vbroadcastss_avx512f(ZEXT416((local_9b0.context)->instID[0]));
                local_c0 = vbroadcastss_avx512f(ZEXT416((local_9b0.context)->instPrimID[0]));
                local_600 = local_300;
                local_9b0.valid = (int *)local_600;
                local_9b0.geometryUserPtr = *(void **)(local_840._0_8_ + 0x18);
                local_9b0.hit = local_2c0;
                local_9b0.N = 0x10;
                local_9b0.ray = (RTCRayN *)ray;
                if (*(code **)(local_840._0_8_ + 0x48) != (code *)0x0) {
                  (**(code **)(local_840._0_8_ + 0x48))(&local_9b0);
                  auVar186 = ZEXT1664(local_950);
                  auVar178 = ZEXT3264(local_8e0);
                  auVar194 = ZEXT3264(local_880);
                  auVar150 = ZEXT3264(local_860);
                  auVar190 = ZEXT3264(local_900);
                  auVar191 = ZEXT3264(local_7e0);
                  auVar192 = ZEXT3264(local_7c0);
                  in_ZMM21 = ZEXT3264(local_820);
                  in_ZMM20 = ZEXT3264(local_800);
                  auVar90 = vxorps_avx512vl(auVar87,auVar87);
                  auVar193 = ZEXT1664(auVar90);
                  fVar162 = local_8a0;
                }
                auVar90 = auVar193._0_16_;
                auVar152 = vmovdqa64_avx512f(local_600);
                uVar142 = vptestmd_avx512f(auVar152,auVar152);
                if ((short)uVar142 == 0) {
                  uVar80 = CONCAT44(uStack_73c,local_740);
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_840._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_9b0);
                    auVar186 = ZEXT1664(local_950);
                    auVar178 = ZEXT3264(local_8e0);
                    auVar194 = ZEXT3264(local_880);
                    auVar150 = ZEXT3264(local_860);
                    auVar190 = ZEXT3264(local_900);
                    auVar191 = ZEXT3264(local_7e0);
                    auVar192 = ZEXT3264(local_7c0);
                    in_ZMM21 = ZEXT3264(local_820);
                    in_ZMM20 = ZEXT3264(local_800);
                    auVar90 = vxorps_avx512vl(auVar90,auVar90);
                    auVar193 = ZEXT1664(auVar90);
                    fVar162 = local_8a0;
                  }
                  auVar96 = auVar178._0_32_;
                  auVar152 = vmovdqa64_avx512f(local_600);
                  uVar78 = vptestmd_avx512f(auVar152,auVar152);
                  auVar175 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar78 & 1);
                  auVar152._0_4_ =
                       (uint)bVar13 * auVar175._0_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x200);
                  bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                  auVar152._4_4_ =
                       (uint)bVar13 * auVar175._4_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x204);
                  bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                  auVar152._8_4_ =
                       (uint)bVar13 * auVar175._8_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x208);
                  bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
                  auVar152._12_4_ =
                       (uint)bVar13 * auVar175._12_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x20c);
                  bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
                  auVar152._16_4_ =
                       (uint)bVar13 * auVar175._16_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x210);
                  bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                  auVar152._20_4_ =
                       (uint)bVar13 * auVar175._20_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x214);
                  bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
                  auVar152._24_4_ =
                       (uint)bVar13 * auVar175._24_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x218);
                  bVar13 = (bool)((byte)(uVar78 >> 7) & 1);
                  auVar152._28_4_ =
                       (uint)bVar13 * auVar175._28_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x21c);
                  bVar13 = (bool)((byte)(uVar78 >> 8) & 1);
                  auVar152._32_4_ =
                       (uint)bVar13 * auVar175._32_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x220);
                  bVar13 = (bool)((byte)(uVar78 >> 9) & 1);
                  auVar152._36_4_ =
                       (uint)bVar13 * auVar175._36_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x224);
                  bVar13 = (bool)((byte)(uVar78 >> 10) & 1);
                  auVar152._40_4_ =
                       (uint)bVar13 * auVar175._40_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x228);
                  bVar13 = (bool)((byte)(uVar78 >> 0xb) & 1);
                  auVar152._44_4_ =
                       (uint)bVar13 * auVar175._44_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x22c);
                  bVar13 = (bool)((byte)(uVar78 >> 0xc) & 1);
                  auVar152._48_4_ =
                       (uint)bVar13 * auVar175._48_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x230);
                  bVar13 = (bool)((byte)(uVar78 >> 0xd) & 1);
                  auVar152._52_4_ =
                       (uint)bVar13 * auVar175._52_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x234);
                  bVar13 = (bool)((byte)(uVar78 >> 0xe) & 1);
                  auVar152._56_4_ =
                       (uint)bVar13 * auVar175._56_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x238);
                  bVar13 = SUB81(uVar78 >> 0xf,0);
                  auVar152._60_4_ =
                       (uint)bVar13 * auVar175._60_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x23c);
                  *(undefined1 (*) [64])(local_9b0.ray + 0x200) = auVar152;
                  uVar80 = CONCAT44(uStack_73c,local_740);
                  if ((short)uVar78 != 0) {
                    uVar78 = (ulong)(uint)local_920._0_4_;
                    fVar140 = auVar186._0_4_;
                    break;
                  }
                }
                auVar96 = auVar178._0_32_;
                *(float *)(ray + k * 4 + 0x200) = local_760;
                lVar82 = 0;
                uVar80 = uVar80 ^ 1L << (local_480._0_8_ & 0x3f);
                for (uVar78 = uVar80; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000)
                {
                  lVar82 = lVar82 + 1;
                }
                uVar78 = CONCAT71((int7)((ulong)pre >> 8),uVar80 != 0);
                fVar140 = auVar186._0_4_;
              } while (uVar80 != 0);
              local_8a0 = fVar140;
              auVar175 = ZEXT3264(auVar99);
              auVar152 = ZEXT3264(auVar98);
              uVar78 = uVar78 & 0xffffffffffffff01;
            }
            uVar78 = uVar78 & 0xffffffff;
          }
        }
      }
      if (8 < iVar10) {
        local_840 = vpbroadcastd_avx512vl();
        local_760 = 1.0 / (float)local_4c0._0_4_;
        auVar76._28_4_ = 0;
        auVar76._0_28_ = stack0xfffffffffffff684;
        _local_980 = auVar76 << 0x20;
        auVar186 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar186);
        auVar186 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar186);
        lVar82 = 8;
        auVar98 = auVar175._0_32_;
        auVar100 = auVar152._0_32_;
        local_8e0 = auVar96;
        fStack_89c = local_8a0;
        fStack_898 = local_8a0;
        fStack_894 = local_8a0;
        fStack_890 = local_8a0;
        fStack_88c = local_8a0;
        fStack_888 = local_8a0;
        fStack_884 = local_8a0;
        fStack_75c = local_760;
        fStack_758 = local_760;
        fStack_754 = local_760;
        fStack_750 = local_760;
        fStack_74c = local_760;
        fStack_748 = local_760;
        fStack_744 = local_760;
        local_740 = fVar162;
        uStack_73c = fVar162;
        uStack_738 = fVar162;
        uStack_734 = fVar162;
        uStack_730 = fVar162;
        uStack_72c = fVar162;
        uStack_728 = fVar162;
        uStack_724 = fVar162;
        do {
          uVar77 = (uint)uVar78;
          local_920._0_4_ = uVar77;
          auVar99 = vpbroadcastd_avx512vl();
          auVar101 = vpor_avx2(auVar99,_DAT_0205a920);
          uVar21 = vpcmpd_avx512vl(auVar101,local_840,1);
          auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar82 * 4 + lVar69);
          auVar110 = *(undefined1 (*) [32])(lVar69 + 0x2227768 + lVar82 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar69 + 0x2227bec + lVar82 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar69 + 0x2228070 + lVar82 * 4);
          local_860 = auVar150._0_32_;
          auVar102 = vmulps_avx512vl(local_860,auVar108);
          local_880 = auVar194._0_32_;
          auVar107 = vmulps_avx512vl(local_880,auVar108);
          auVar50._4_4_ = auVar108._4_4_ * (float)local_3e0._4_4_;
          auVar50._0_4_ = auVar108._0_4_ * (float)local_3e0._0_4_;
          auVar50._8_4_ = auVar108._8_4_ * fStack_3d8;
          auVar50._12_4_ = auVar108._12_4_ * fStack_3d4;
          auVar50._16_4_ = auVar108._16_4_ * fStack_3d0;
          auVar50._20_4_ = auVar108._20_4_ * fStack_3cc;
          auVar50._24_4_ = auVar108._24_4_ * fStack_3c8;
          auVar50._28_4_ = auVar101._28_4_;
          auVar101 = vfmadd231ps_avx512vl(auVar102,auVar109,local_340);
          auVar102 = vfmadd231ps_avx512vl(auVar107,auVar109,local_360);
          auVar107 = vfmadd231ps_avx512vl(auVar50,auVar109,local_3c0);
          auVar174 = auVar190._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,auVar174);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar110,local_580);
          auVar90 = vfmadd231ps_fma(auVar107,auVar110,local_3a0);
          auVar184 = auVar192._0_32_;
          auVar103 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar184);
          auVar176 = auVar191._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar176);
          auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar82 * 4 + lVar69);
          auVar102 = *(undefined1 (*) [32])(lVar69 + 0x2229b88 + lVar82 * 4);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar99,local_380);
          auVar107 = *(undefined1 (*) [32])(lVar69 + 0x222a00c + lVar82 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar69 + 0x222a490 + lVar82 * 4);
          auVar96 = vmulps_avx512vl(local_860,auVar106);
          auVar97 = vmulps_avx512vl(local_880,auVar106);
          auVar51._4_4_ = auVar106._4_4_ * (float)local_3e0._4_4_;
          auVar51._0_4_ = auVar106._0_4_ * (float)local_3e0._0_4_;
          auVar51._8_4_ = auVar106._8_4_ * fStack_3d8;
          auVar51._12_4_ = auVar106._12_4_ * fStack_3d4;
          auVar51._16_4_ = auVar106._16_4_ * fStack_3d0;
          auVar51._20_4_ = auVar106._20_4_ * fStack_3cc;
          auVar51._24_4_ = auVar106._24_4_ * fStack_3c8;
          auVar51._28_4_ = uStack_3c4;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,local_340);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar107,local_360);
          auVar95 = vfmadd231ps_avx512vl(auVar51,auVar107,local_3c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar174);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_580);
          auVar89 = vfmadd231ps_fma(auVar95,auVar102,local_3a0);
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar184);
          auVar104 = vfmadd231ps_avx512vl(auVar97,auVar101,auVar176);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar101,local_380);
          auVar105 = vmaxps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar89));
          auVar96 = vsubps_avx(auVar95,auVar103);
          auVar97 = vsubps_avx(auVar104,auVar94);
          auVar121 = vmulps_avx512vl(auVar94,auVar96);
          auVar122 = vmulps_avx512vl(auVar103,auVar97);
          auVar121 = vsubps_avx512vl(auVar121,auVar122);
          auVar122 = vmulps_avx512vl(auVar97,auVar97);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar96,auVar96);
          auVar105 = vmulps_avx512vl(auVar105,auVar105);
          auVar105 = vmulps_avx512vl(auVar105,auVar122);
          auVar121 = vmulps_avx512vl(auVar121,auVar121);
          uVar142 = vcmpps_avx512vl(auVar121,auVar105,2);
          local_670 = (byte)uVar21 & (byte)uVar142;
          if (local_670 == 0) {
            auVar190 = ZEXT3264(auVar174);
LAB_01d27818:
            auVar186 = ZEXT3264(auVar176);
          }
          else {
            auVar106 = vmulps_avx512vl(local_8e0,auVar106);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_440,auVar106);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_420,auVar107);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_400,auVar102);
            auVar108 = vmulps_avx512vl(local_8e0,auVar108);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_440,auVar108);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_420,auVar109);
            auVar102 = vfmadd213ps_avx512vl(auVar99,local_400,auVar110);
            auVar99 = *(undefined1 (*) [32])(lVar69 + 0x22284f4 + lVar82 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar69 + 0x2228978 + lVar82 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar69 + 0x2228dfc + lVar82 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar69 + 0x2229280 + lVar82 * 4);
            auVar107 = vmulps_avx512vl(local_860,auVar108);
            auVar106 = vmulps_avx512vl(local_880,auVar108);
            auVar108 = vmulps_avx512vl(local_8e0,auVar108);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,local_340);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,local_360);
            auVar109 = vfmadd231ps_avx512vl(auVar108,local_440,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar174);
            auVar107 = vfmadd231ps_avx512vl(auVar106,auVar110,local_580);
            auVar110 = vfmadd231ps_avx512vl(auVar109,local_420,auVar110);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar99,auVar184);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar176);
            auVar106 = vfmadd231ps_avx512vl(auVar110,local_400,auVar99);
            auVar99 = *(undefined1 (*) [32])(lVar69 + 0x222a914 + lVar82 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar69 + 0x222b21c + lVar82 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar69 + 0x222b6a0 + lVar82 * 4);
            auVar105 = vmulps_avx512vl(local_860,auVar109);
            auVar121 = vmulps_avx512vl(local_880,auVar109);
            auVar109 = vmulps_avx512vl(local_8e0,auVar109);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_340);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar110,local_360);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_440,auVar110);
            auVar110 = *(undefined1 (*) [32])(lVar69 + 0x222ad98 + lVar82 * 4);
            auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar174);
            auVar87 = vfmadd231ps_fma(auVar121,auVar110,local_580);
            auVar110 = vfmadd231ps_avx512vl(auVar109,local_420,auVar110);
            auVar109 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar184);
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar99,auVar176);
            auVar110 = vfmadd231ps_avx512vl(auVar110,local_400,auVar99);
            auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar108,auVar121);
            vandps_avx512vl(auVar107,auVar121);
            auVar99 = vmaxps_avx(auVar121,auVar121);
            vandps_avx512vl(auVar106,auVar121);
            auVar99 = vmaxps_avx(auVar99,auVar121);
            auVar74._4_4_ = fStack_89c;
            auVar74._0_4_ = local_8a0;
            auVar74._8_4_ = fStack_898;
            auVar74._12_4_ = fStack_894;
            auVar74._16_4_ = fStack_890;
            auVar74._20_4_ = fStack_88c;
            auVar74._24_4_ = fStack_888;
            auVar74._28_4_ = fStack_884;
            uVar78 = vcmpps_avx512vl(auVar99,auVar74,1);
            bVar13 = (bool)((byte)uVar78 & 1);
            auVar123._0_4_ = (float)((uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar108._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar108._4_4_);
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar108._8_4_);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar108._12_4_);
            bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar123._16_4_ =
                 (float)((uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar108._16_4_);
            bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar123._20_4_ =
                 (float)((uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar108._20_4_);
            bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar123._24_4_ =
                 (float)((uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar108._24_4_);
            bVar13 = SUB81(uVar78 >> 7,0);
            auVar123._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar108._28_4_;
            bVar13 = (bool)((byte)uVar78 & 1);
            auVar124._0_4_ = (float)((uint)bVar13 * auVar97._0_4_ | (uint)!bVar13 * auVar107._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar107._4_4_);
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar107._8_4_);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar107._12_4_);
            bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar107._16_4_);
            bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar107._20_4_);
            bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar107._24_4_);
            bVar13 = SUB81(uVar78 >> 7,0);
            auVar124._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar107._28_4_;
            vandps_avx512vl(auVar109,auVar121);
            vandps_avx512vl(auVar105,auVar121);
            auVar99 = vmaxps_avx(auVar124,auVar124);
            vandps_avx512vl(auVar110,auVar121);
            auVar99 = vmaxps_avx(auVar99,auVar124);
            uVar78 = vcmpps_avx512vl(auVar99,auVar74,1);
            bVar13 = (bool)((byte)uVar78 & 1);
            auVar125._0_4_ = (uint)bVar13 * auVar96._0_4_ | (uint)!bVar13 * auVar109._0_4_;
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar109._4_4_;
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar109._8_4_;
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar109._12_4_;
            bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar125._16_4_ = (uint)bVar13 * auVar96._16_4_ | (uint)!bVar13 * auVar109._16_4_;
            bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar125._20_4_ = (uint)bVar13 * auVar96._20_4_ | (uint)!bVar13 * auVar109._20_4_;
            bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar125._24_4_ = (uint)bVar13 * auVar96._24_4_ | (uint)!bVar13 * auVar109._24_4_;
            bVar13 = SUB81(uVar78 >> 7,0);
            auVar125._28_4_ = (uint)bVar13 * auVar96._28_4_ | (uint)!bVar13 * auVar109._28_4_;
            bVar13 = (bool)((byte)uVar78 & 1);
            auVar126._0_4_ = (float)((uint)bVar13 * auVar97._0_4_ | (uint)!bVar13 * auVar105._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar105._4_4_);
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar105._8_4_);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar105._12_4_);
            bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar13 * auVar97._16_4_ | (uint)!bVar13 * auVar105._16_4_);
            bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar13 * auVar97._20_4_ | (uint)!bVar13 * auVar105._20_4_);
            bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar13 * auVar97._24_4_ | (uint)!bVar13 * auVar105._24_4_);
            bVar13 = SUB81(uVar78 >> 7,0);
            auVar126._28_4_ = (uint)bVar13 * auVar97._28_4_ | (uint)!bVar13 * auVar105._28_4_;
            auVar180._8_4_ = 0x80000000;
            auVar180._0_8_ = 0x8000000080000000;
            auVar180._12_4_ = 0x80000000;
            auVar180._16_4_ = 0x80000000;
            auVar180._20_4_ = 0x80000000;
            auVar180._24_4_ = 0x80000000;
            auVar180._28_4_ = 0x80000000;
            auVar99 = vxorps_avx512vl(auVar125,auVar180);
            auVar105 = auVar193._0_32_;
            auVar110 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar105);
            auVar87 = vfmadd231ps_fma(auVar110,auVar124,auVar124);
            auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
            auVar189._8_4_ = 0xbf000000;
            auVar189._0_8_ = 0xbf000000bf000000;
            auVar189._12_4_ = 0xbf000000;
            auVar189._16_4_ = 0xbf000000;
            auVar189._20_4_ = 0xbf000000;
            auVar189._24_4_ = 0xbf000000;
            auVar189._28_4_ = 0xbf000000;
            fVar162 = auVar110._0_4_;
            fVar140 = auVar110._4_4_;
            fVar167 = auVar110._8_4_;
            fVar168 = auVar110._12_4_;
            fVar169 = auVar110._16_4_;
            fVar154 = auVar110._20_4_;
            fVar161 = auVar110._24_4_;
            auVar52._4_4_ = fVar140 * fVar140 * fVar140 * auVar87._4_4_ * -0.5;
            auVar52._0_4_ = fVar162 * fVar162 * fVar162 * auVar87._0_4_ * -0.5;
            auVar52._8_4_ = fVar167 * fVar167 * fVar167 * auVar87._8_4_ * -0.5;
            auVar52._12_4_ = fVar168 * fVar168 * fVar168 * auVar87._12_4_ * -0.5;
            auVar52._16_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar52._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
            auVar52._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar52._28_4_ = auVar124._28_4_;
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar110 = vfmadd231ps_avx512vl(auVar52,auVar109,auVar110);
            auVar53._4_4_ = auVar124._4_4_ * auVar110._4_4_;
            auVar53._0_4_ = auVar124._0_4_ * auVar110._0_4_;
            auVar53._8_4_ = auVar124._8_4_ * auVar110._8_4_;
            auVar53._12_4_ = auVar124._12_4_ * auVar110._12_4_;
            auVar53._16_4_ = auVar124._16_4_ * auVar110._16_4_;
            auVar53._20_4_ = auVar124._20_4_ * auVar110._20_4_;
            auVar53._24_4_ = auVar124._24_4_ * auVar110._24_4_;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = auVar110._4_4_ * -auVar123._4_4_;
            auVar54._0_4_ = auVar110._0_4_ * -auVar123._0_4_;
            auVar54._8_4_ = auVar110._8_4_ * -auVar123._8_4_;
            auVar54._12_4_ = auVar110._12_4_ * -auVar123._12_4_;
            auVar54._16_4_ = auVar110._16_4_ * -auVar123._16_4_;
            auVar54._20_4_ = auVar110._20_4_ * -auVar123._20_4_;
            auVar54._24_4_ = auVar110._24_4_ * -auVar123._24_4_;
            auVar54._28_4_ = auVar124._28_4_;
            auVar108 = vmulps_avx512vl(auVar110,auVar105);
            auVar110 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar105);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar126,auVar126);
            auVar107 = vrsqrt14ps_avx512vl(auVar110);
            auVar110 = vmulps_avx512vl(auVar110,auVar189);
            fVar162 = auVar107._0_4_;
            fVar140 = auVar107._4_4_;
            fVar167 = auVar107._8_4_;
            fVar168 = auVar107._12_4_;
            fVar169 = auVar107._16_4_;
            fVar154 = auVar107._20_4_;
            fVar161 = auVar107._24_4_;
            auVar55._4_4_ = fVar140 * fVar140 * fVar140 * auVar110._4_4_;
            auVar55._0_4_ = fVar162 * fVar162 * fVar162 * auVar110._0_4_;
            auVar55._8_4_ = fVar167 * fVar167 * fVar167 * auVar110._8_4_;
            auVar55._12_4_ = fVar168 * fVar168 * fVar168 * auVar110._12_4_;
            auVar55._16_4_ = fVar169 * fVar169 * fVar169 * auVar110._16_4_;
            auVar55._20_4_ = fVar154 * fVar154 * fVar154 * auVar110._20_4_;
            auVar55._24_4_ = fVar161 * fVar161 * fVar161 * auVar110._24_4_;
            auVar55._28_4_ = auVar110._28_4_;
            auVar110 = vfmadd231ps_avx512vl(auVar55,auVar109,auVar107);
            auVar56._4_4_ = auVar126._4_4_ * auVar110._4_4_;
            auVar56._0_4_ = auVar126._0_4_ * auVar110._0_4_;
            auVar56._8_4_ = auVar126._8_4_ * auVar110._8_4_;
            auVar56._12_4_ = auVar126._12_4_ * auVar110._12_4_;
            auVar56._16_4_ = auVar126._16_4_ * auVar110._16_4_;
            auVar56._20_4_ = auVar126._20_4_ * auVar110._20_4_;
            auVar56._24_4_ = auVar126._24_4_ * auVar110._24_4_;
            auVar56._28_4_ = auVar107._28_4_;
            auVar57._4_4_ = auVar110._4_4_ * auVar99._4_4_;
            auVar57._0_4_ = auVar110._0_4_ * auVar99._0_4_;
            auVar57._8_4_ = auVar110._8_4_ * auVar99._8_4_;
            auVar57._12_4_ = auVar110._12_4_ * auVar99._12_4_;
            auVar57._16_4_ = auVar110._16_4_ * auVar99._16_4_;
            auVar57._20_4_ = auVar110._20_4_ * auVar99._20_4_;
            auVar57._24_4_ = auVar110._24_4_ * auVar99._24_4_;
            auVar57._28_4_ = auVar99._28_4_;
            auVar99 = vmulps_avx512vl(auVar110,auVar105);
            auVar87 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar90),auVar103);
            auVar110 = ZEXT1632(auVar90);
            auVar5 = vfmadd213ps_fma(auVar54,auVar110,auVar94);
            auVar109 = vfmadd213ps_avx512vl(auVar108,auVar110,auVar102);
            auVar107 = vfmadd213ps_avx512vl(auVar56,ZEXT1632(auVar89),auVar95);
            auVar91 = vfnmadd213ps_fma(auVar53,auVar110,auVar103);
            auVar106 = ZEXT1632(auVar89);
            auVar6 = vfmadd213ps_fma(auVar57,auVar106,auVar104);
            auVar92 = vfnmadd213ps_fma(auVar54,auVar110,auVar94);
            auVar7 = vfmadd213ps_fma(auVar99,auVar106,auVar101);
            auVar94 = ZEXT1632(auVar90);
            auVar93 = vfnmadd231ps_fma(auVar102,auVar94,auVar108);
            auVar155 = vfnmadd213ps_fma(auVar56,auVar106,auVar95);
            auVar156 = vfnmadd213ps_fma(auVar57,auVar106,auVar104);
            auVar179 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar89),auVar99);
            auVar101 = vsubps_avx512vl(auVar107,ZEXT1632(auVar91));
            auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar92));
            auVar110 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar93));
            auVar58._4_4_ = auVar99._4_4_ * auVar93._4_4_;
            auVar58._0_4_ = auVar99._0_4_ * auVar93._0_4_;
            auVar58._8_4_ = auVar99._8_4_ * auVar93._8_4_;
            auVar58._12_4_ = auVar99._12_4_ * auVar93._12_4_;
            auVar58._16_4_ = auVar99._16_4_ * 0.0;
            auVar58._20_4_ = auVar99._20_4_ * 0.0;
            auVar58._24_4_ = auVar99._24_4_ * 0.0;
            auVar58._28_4_ = auVar108._28_4_;
            auVar90 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar92),auVar110);
            auVar59._4_4_ = auVar110._4_4_ * auVar91._4_4_;
            auVar59._0_4_ = auVar110._0_4_ * auVar91._0_4_;
            auVar59._8_4_ = auVar110._8_4_ * auVar91._8_4_;
            auVar59._12_4_ = auVar110._12_4_ * auVar91._12_4_;
            auVar59._16_4_ = auVar110._16_4_ * 0.0;
            auVar59._20_4_ = auVar110._20_4_ * 0.0;
            auVar59._24_4_ = auVar110._24_4_ * 0.0;
            auVar59._28_4_ = auVar110._28_4_;
            auVar8 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar93),auVar101);
            auVar60._4_4_ = auVar92._4_4_ * auVar101._4_4_;
            auVar60._0_4_ = auVar92._0_4_ * auVar101._0_4_;
            auVar60._8_4_ = auVar92._8_4_ * auVar101._8_4_;
            auVar60._12_4_ = auVar92._12_4_ * auVar101._12_4_;
            auVar60._16_4_ = auVar101._16_4_ * 0.0;
            auVar60._20_4_ = auVar101._20_4_ * 0.0;
            auVar60._24_4_ = auVar101._24_4_ * 0.0;
            auVar60._28_4_ = auVar101._28_4_;
            auVar88 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar91),auVar99);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar105,ZEXT1632(auVar8));
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,ZEXT1632(auVar90));
            uVar78 = vcmpps_avx512vl(auVar99,auVar105,2);
            bVar81 = (byte)uVar78;
            fVar132 = (float)((uint)(bVar81 & 1) * auVar87._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * auVar155._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            fVar134 = (float)((uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * auVar155._4_4_);
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            fVar136 = (float)((uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * auVar155._8_4_);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            fVar138 = (float)((uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * auVar155._12_4_);
            auVar106 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar132))));
            fVar133 = (float)((uint)(bVar81 & 1) * auVar5._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * auVar156._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            fVar135 = (float)((uint)bVar13 * auVar5._4_4_ | (uint)!bVar13 * auVar156._4_4_);
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            fVar137 = (float)((uint)bVar13 * auVar5._8_4_ | (uint)!bVar13 * auVar156._8_4_);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            fVar139 = (float)((uint)bVar13 * auVar5._12_4_ | (uint)!bVar13 * auVar156._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar133))));
            auVar127._0_4_ =
                 (float)((uint)(bVar81 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar179._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar179._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar179._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar179._12_4_);
            fVar167 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar109._16_4_);
            auVar127._16_4_ = fVar167;
            fVar140 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar109._20_4_);
            auVar127._20_4_ = fVar140;
            fVar162 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar109._24_4_);
            auVar127._24_4_ = fVar162;
            iVar1 = (uint)(byte)(uVar78 >> 7) * auVar109._28_4_;
            auVar127._28_4_ = iVar1;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar107);
            auVar128._0_4_ =
                 (uint)(bVar81 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar81 & 1) * auVar90._0_4_;
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar128._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar90._4_4_;
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar128._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar90._8_4_;
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar128._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar90._12_4_;
            auVar128._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar99._16_4_;
            auVar128._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar99._20_4_;
            auVar128._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar99._24_4_;
            auVar128._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar6));
            auVar129._0_4_ =
                 (float)((uint)(bVar81 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar87._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar87._4_4_);
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar87._8_4_);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar87._12_4_);
            fVar154 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar99._16_4_);
            auVar129._16_4_ = fVar154;
            fVar169 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar99._20_4_);
            auVar129._20_4_ = fVar169;
            fVar168 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar99._24_4_);
            auVar129._24_4_ = fVar168;
            auVar129._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar99._28_4_;
            auVar99 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar7));
            auVar130._0_4_ =
                 (float)((uint)(bVar81 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar81 & 1) * auVar5._0_4_);
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar5._4_4_);
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar5._8_4_);
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar130._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar5._12_4_)
            ;
            fVar161 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar99._16_4_);
            auVar130._16_4_ = fVar161;
            fVar86 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar99._20_4_);
            auVar130._20_4_ = fVar86;
            fVar153 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar99._24_4_);
            auVar130._24_4_ = fVar153;
            iVar2 = (uint)(byte)(uVar78 >> 7) * auVar99._28_4_;
            auVar130._28_4_ = iVar2;
            auVar131._0_4_ =
                 (uint)(bVar81 & 1) * (int)auVar91._0_4_ |
                 (uint)!(bool)(bVar81 & 1) * auVar107._0_4_;
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar13 * (int)auVar91._4_4_ | (uint)!bVar13 * auVar107._4_4_;
            bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar13 * (int)auVar91._8_4_ | (uint)!bVar13 * auVar107._8_4_;
            bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar13 * (int)auVar91._12_4_ | (uint)!bVar13 * auVar107._12_4_;
            auVar131._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar107._16_4_;
            auVar131._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar107._20_4_;
            auVar131._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar107._24_4_;
            auVar131._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar107._28_4_;
            bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar78 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar78 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar107 = vsubps_avx512vl(auVar131,auVar106);
            auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar92._12_4_ |
                                                     (uint)!bVar17 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar92._8_4_ |
                                                              (uint)!bVar15 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar92._4_4_ |
                                                                       (uint)!bVar13 * auVar6._4_4_,
                                                                       (uint)(bVar81 & 1) *
                                                                       (int)auVar92._0_4_ |
                                                                       (uint)!(bool)(bVar81 & 1) *
                                                                       auVar6._0_4_)))),auVar96);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar93._12_4_ |
                                                     (uint)!bVar18 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar93._8_4_ |
                                                              (uint)!bVar16 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar14 * auVar7._4_4_,
                                                                       (uint)(bVar81 & 1) *
                                                                       (int)auVar93._0_4_ |
                                                                       (uint)!(bool)(bVar81 & 1) *
                                                                       auVar7._0_4_)))),auVar127);
            auVar108 = vsubps_avx(auVar106,auVar128);
            auVar101 = vsubps_avx(auVar96,auVar129);
            auVar102 = vsubps_avx(auVar127,auVar130);
            auVar61._4_4_ = auVar109._4_4_ * fVar134;
            auVar61._0_4_ = auVar109._0_4_ * fVar132;
            auVar61._8_4_ = auVar109._8_4_ * fVar136;
            auVar61._12_4_ = auVar109._12_4_ * fVar138;
            auVar61._16_4_ = auVar109._16_4_ * 0.0;
            auVar61._20_4_ = auVar109._20_4_ * 0.0;
            auVar61._24_4_ = auVar109._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar61,auVar127,auVar107);
            auVar160._0_4_ = fVar133 * auVar107._0_4_;
            auVar160._4_4_ = fVar135 * auVar107._4_4_;
            auVar160._8_4_ = fVar137 * auVar107._8_4_;
            auVar160._12_4_ = fVar139 * auVar107._12_4_;
            auVar160._16_4_ = auVar107._16_4_ * 0.0;
            auVar160._20_4_ = auVar107._20_4_ * 0.0;
            auVar160._24_4_ = auVar107._24_4_ * 0.0;
            auVar160._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar160,auVar106,auVar110);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar105,ZEXT1632(auVar90));
            auVar165._0_4_ = auVar110._0_4_ * auVar127._0_4_;
            auVar165._4_4_ = auVar110._4_4_ * auVar127._4_4_;
            auVar165._8_4_ = auVar110._8_4_ * auVar127._8_4_;
            auVar165._12_4_ = auVar110._12_4_ * auVar127._12_4_;
            auVar165._16_4_ = auVar110._16_4_ * fVar167;
            auVar165._20_4_ = auVar110._20_4_ * fVar140;
            auVar165._24_4_ = auVar110._24_4_ * fVar162;
            auVar165._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar165,auVar96,auVar109);
            auVar97 = vfmadd231ps_avx512vl(auVar99,auVar105,ZEXT1632(auVar90));
            auVar99 = vmulps_avx512vl(auVar102,auVar128);
            auVar99 = vfmsub231ps_avx512vl(auVar99,auVar108,auVar130);
            auVar62._4_4_ = auVar101._4_4_ * auVar130._4_4_;
            auVar62._0_4_ = auVar101._0_4_ * auVar130._0_4_;
            auVar62._8_4_ = auVar101._8_4_ * auVar130._8_4_;
            auVar62._12_4_ = auVar101._12_4_ * auVar130._12_4_;
            auVar62._16_4_ = auVar101._16_4_ * fVar161;
            auVar62._20_4_ = auVar101._20_4_ * fVar86;
            auVar62._24_4_ = auVar101._24_4_ * fVar153;
            auVar62._28_4_ = iVar2;
            auVar90 = vfmsub231ps_fma(auVar62,auVar129,auVar102);
            auVar166._0_4_ = auVar129._0_4_ * auVar108._0_4_;
            auVar166._4_4_ = auVar129._4_4_ * auVar108._4_4_;
            auVar166._8_4_ = auVar129._8_4_ * auVar108._8_4_;
            auVar166._12_4_ = auVar129._12_4_ * auVar108._12_4_;
            auVar166._16_4_ = fVar154 * auVar108._16_4_;
            auVar166._20_4_ = fVar169 * auVar108._20_4_;
            auVar166._24_4_ = fVar168 * auVar108._24_4_;
            auVar166._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar166,auVar101,auVar128);
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar105,auVar99);
            auVar103 = vfmadd231ps_avx512vl(auVar99,auVar105,ZEXT1632(auVar90));
            auVar99 = vmaxps_avx(auVar97,auVar103);
            uVar142 = vcmpps_avx512vl(auVar99,auVar105,2);
            local_670 = local_670 & (byte)uVar142;
            auVar186 = ZEXT3264(auVar176);
            if (local_670 == 0) {
LAB_01d27859:
              local_670 = 0;
            }
            else {
              auVar63._4_4_ = auVar102._4_4_ * auVar110._4_4_;
              auVar63._0_4_ = auVar102._0_4_ * auVar110._0_4_;
              auVar63._8_4_ = auVar102._8_4_ * auVar110._8_4_;
              auVar63._12_4_ = auVar102._12_4_ * auVar110._12_4_;
              auVar63._16_4_ = auVar102._16_4_ * auVar110._16_4_;
              auVar63._20_4_ = auVar102._20_4_ * auVar110._20_4_;
              auVar63._24_4_ = auVar102._24_4_ * auVar110._24_4_;
              auVar63._28_4_ = auVar99._28_4_;
              auVar5 = vfmsub231ps_fma(auVar63,auVar101,auVar109);
              auVar64._4_4_ = auVar109._4_4_ * auVar108._4_4_;
              auVar64._0_4_ = auVar109._0_4_ * auVar108._0_4_;
              auVar64._8_4_ = auVar109._8_4_ * auVar108._8_4_;
              auVar64._12_4_ = auVar109._12_4_ * auVar108._12_4_;
              auVar64._16_4_ = auVar109._16_4_ * auVar108._16_4_;
              auVar64._20_4_ = auVar109._20_4_ * auVar108._20_4_;
              auVar64._24_4_ = auVar109._24_4_ * auVar108._24_4_;
              auVar64._28_4_ = auVar109._28_4_;
              auVar87 = vfmsub231ps_fma(auVar64,auVar107,auVar102);
              auVar65._4_4_ = auVar101._4_4_ * auVar107._4_4_;
              auVar65._0_4_ = auVar101._0_4_ * auVar107._0_4_;
              auVar65._8_4_ = auVar101._8_4_ * auVar107._8_4_;
              auVar65._12_4_ = auVar101._12_4_ * auVar107._12_4_;
              auVar65._16_4_ = auVar101._16_4_ * auVar107._16_4_;
              auVar65._20_4_ = auVar101._20_4_ * auVar107._20_4_;
              auVar65._24_4_ = auVar101._24_4_ * auVar107._24_4_;
              auVar65._28_4_ = auVar101._28_4_;
              auVar6 = vfmsub231ps_fma(auVar65,auVar108,auVar110);
              auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar6));
              auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar5),auVar105);
              auVar110 = vrcp14ps_avx512vl(auVar99);
              auVar27._8_4_ = 0x3f800000;
              auVar27._0_8_ = &DAT_3f8000003f800000;
              auVar27._12_4_ = 0x3f800000;
              auVar27._16_4_ = 0x3f800000;
              auVar27._20_4_ = 0x3f800000;
              auVar27._24_4_ = 0x3f800000;
              auVar27._28_4_ = 0x3f800000;
              auVar109 = vfnmadd213ps_avx512vl(auVar110,auVar99,auVar27);
              auVar90 = vfmadd132ps_fma(auVar109,auVar110,auVar110);
              auVar66._4_4_ = auVar6._4_4_ * auVar127._4_4_;
              auVar66._0_4_ = auVar6._0_4_ * auVar127._0_4_;
              auVar66._8_4_ = auVar6._8_4_ * auVar127._8_4_;
              auVar66._12_4_ = auVar6._12_4_ * auVar127._12_4_;
              auVar66._16_4_ = fVar167 * 0.0;
              auVar66._20_4_ = fVar140 * 0.0;
              auVar66._24_4_ = fVar162 * 0.0;
              auVar66._28_4_ = iVar1;
              auVar87 = vfmadd231ps_fma(auVar66,auVar96,ZEXT1632(auVar87));
              auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar106,ZEXT1632(auVar5));
              fVar162 = auVar90._0_4_;
              fVar140 = auVar90._4_4_;
              fVar167 = auVar90._8_4_;
              fVar168 = auVar90._12_4_;
              auVar110 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar168,
                                            CONCAT48(auVar87._8_4_ * fVar167,
                                                     CONCAT44(auVar87._4_4_ * fVar140,
                                                              auVar87._0_4_ * fVar162))));
              auVar75._4_4_ = uStack_73c;
              auVar75._0_4_ = local_740;
              auVar75._8_4_ = uStack_738;
              auVar75._12_4_ = uStack_734;
              auVar75._16_4_ = uStack_730;
              auVar75._20_4_ = uStack_72c;
              auVar75._24_4_ = uStack_728;
              auVar75._28_4_ = uStack_724;
              uVar142 = vcmpps_avx512vl(auVar110,auVar75,0xd);
              uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar28._4_4_ = uVar141;
              auVar28._0_4_ = uVar141;
              auVar28._8_4_ = uVar141;
              auVar28._12_4_ = uVar141;
              auVar28._16_4_ = uVar141;
              auVar28._20_4_ = uVar141;
              auVar28._24_4_ = uVar141;
              auVar28._28_4_ = uVar141;
              uVar21 = vcmpps_avx512vl(auVar110,auVar28,2);
              local_670 = (byte)uVar142 & (byte)uVar21 & local_670;
              if (local_670 == 0) goto LAB_01d27859;
              uVar142 = vcmpps_avx512vl(auVar99,auVar105,4);
              if ((local_670 & (byte)uVar142) == 0) {
                local_670 = 0;
              }
              else {
                local_670 = local_670 & (byte)uVar142;
                fVar169 = auVar97._0_4_ * fVar162;
                fVar154 = auVar97._4_4_ * fVar140;
                auVar67._4_4_ = fVar154;
                auVar67._0_4_ = fVar169;
                fVar161 = auVar97._8_4_ * fVar167;
                auVar67._8_4_ = fVar161;
                fVar86 = auVar97._12_4_ * fVar168;
                auVar67._12_4_ = fVar86;
                fVar153 = auVar97._16_4_ * 0.0;
                auVar67._16_4_ = fVar153;
                fVar132 = auVar97._20_4_ * 0.0;
                auVar67._20_4_ = fVar132;
                fVar133 = auVar97._24_4_ * 0.0;
                auVar67._24_4_ = fVar133;
                auVar67._28_4_ = auVar97._28_4_;
                fVar162 = auVar103._0_4_ * fVar162;
                fVar140 = auVar103._4_4_ * fVar140;
                auVar68._4_4_ = fVar140;
                auVar68._0_4_ = fVar162;
                fVar167 = auVar103._8_4_ * fVar167;
                auVar68._8_4_ = fVar167;
                fVar168 = auVar103._12_4_ * fVar168;
                auVar68._12_4_ = fVar168;
                fVar134 = auVar103._16_4_ * 0.0;
                auVar68._16_4_ = fVar134;
                fVar135 = auVar103._20_4_ * 0.0;
                auVar68._20_4_ = fVar135;
                fVar136 = auVar103._24_4_ * 0.0;
                auVar68._24_4_ = fVar136;
                auVar68._28_4_ = auVar103._28_4_;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = &DAT_3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx512vl(auVar173,auVar67);
                bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                bVar19 = SUB81(uVar78 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar97._28_4_ |
                                              (uint)!bVar19 * auVar99._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar133 |
                                                        (uint)!bVar18 * auVar99._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar132 |
                                                                  (uint)!bVar17 * auVar99._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar153 |
                                                                            (uint)!bVar16 *
                                                                            auVar99._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar86 |
                                                                                      (uint)!bVar15
                                                                                      * auVar99.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar161 |
                                                                  (uint)!bVar14 * auVar99._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar154 |
                                                                           (uint)!bVar13 *
                                                                           auVar99._4_4_,
                                                                           (uint)(bVar81 & 1) *
                                                                           (int)fVar169 |
                                                                           (uint)!(bool)(bVar81 & 1)
                                                                           * auVar99._0_4_))))))));
                auVar99 = vsubps_avx(auVar173,auVar68);
                bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar78 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar78 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar78 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                bVar19 = SUB81(uVar78 >> 7,0);
                local_5c0._4_4_ = (uint)bVar13 * (int)fVar140 | (uint)!bVar13 * auVar99._4_4_;
                local_5c0._0_4_ =
                     (uint)(bVar81 & 1) * (int)fVar162 | (uint)!(bool)(bVar81 & 1) * auVar99._0_4_;
                local_5c0._8_4_ = (uint)bVar14 * (int)fVar167 | (uint)!bVar14 * auVar99._8_4_;
                local_5c0._12_4_ = (uint)bVar15 * (int)fVar168 | (uint)!bVar15 * auVar99._12_4_;
                local_5c0._16_4_ = (uint)bVar16 * (int)fVar134 | (uint)!bVar16 * auVar99._16_4_;
                local_5c0._20_4_ = (uint)bVar17 * (int)fVar135 | (uint)!bVar17 * auVar99._20_4_;
                local_5c0._24_4_ = (uint)bVar18 * (int)fVar136 | (uint)!bVar18 * auVar99._24_4_;
                local_5c0._28_4_ = (uint)bVar19 * auVar103._28_4_ | (uint)!bVar19 * auVar99._28_4_;
                in_ZMM21 = ZEXT3264(auVar110);
              }
            }
            auVar190 = ZEXT3264(local_900);
            if (local_670 == 0) goto LAB_01d27818;
            auVar99 = vsubps_avx(ZEXT1632(auVar89),auVar94);
            local_800 = in_ZMM20._0_32_;
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_800,auVar94);
            auVar148._0_4_ = auVar99._0_4_ + auVar99._0_4_;
            auVar148._4_4_ = auVar99._4_4_ + auVar99._4_4_;
            auVar148._8_4_ = auVar99._8_4_ + auVar99._8_4_;
            auVar148._12_4_ = auVar99._12_4_ + auVar99._12_4_;
            auVar148._16_4_ = auVar99._16_4_ + auVar99._16_4_;
            auVar148._20_4_ = auVar99._20_4_ + auVar99._20_4_;
            auVar148._24_4_ = auVar99._24_4_ + auVar99._24_4_;
            auVar148._28_4_ = auVar99._28_4_ + auVar99._28_4_;
            uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar29._4_4_ = uVar141;
            auVar29._0_4_ = uVar141;
            auVar29._8_4_ = uVar141;
            auVar29._12_4_ = uVar141;
            auVar29._16_4_ = uVar141;
            auVar29._20_4_ = uVar141;
            auVar29._24_4_ = uVar141;
            auVar29._28_4_ = uVar141;
            auVar99 = vmulps_avx512vl(auVar148,auVar29);
            local_820 = in_ZMM21._0_32_;
            uVar142 = vcmpps_avx512vl(local_820,auVar99,6);
            local_670 = local_670 & (byte)uVar142;
            if (local_670 == 0) goto LAB_01d27818;
            auVar149._8_4_ = 0xbf800000;
            auVar149._0_8_ = 0xbf800000bf800000;
            auVar149._12_4_ = 0xbf800000;
            auVar149._16_4_ = 0xbf800000;
            auVar149._20_4_ = 0xbf800000;
            auVar149._24_4_ = 0xbf800000;
            auVar149._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_5c0,auVar149,auVar30);
            local_5c0 = local_700;
            auVar99 = local_5c0;
            local_6c0 = (undefined4)lVar82;
            local_6a0 = local_770._0_8_;
            uStack_698 = local_770._8_8_;
            local_690 = local_780._0_8_;
            uStack_688 = local_780._8_8_;
            local_680 = local_790._0_8_;
            uStack_678 = local_790._8_8_;
            pGVar11 = (context->scene->geometries).items[uVar83].ptr;
            local_980 = (undefined1  [8])pGVar11;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
              bVar81 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar81 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar110 = vaddps_avx512vl(local_800,_DAT_02020f40);
              auVar90 = vcvtsi2ss_avx512f(auVar191._0_16_,local_6c0);
              fVar162 = auVar90._0_4_;
              local_660[0] = (fVar162 + auVar110._0_4_) * local_760;
              local_660[1] = (fVar162 + auVar110._4_4_) * fStack_75c;
              local_660[2] = (fVar162 + auVar110._8_4_) * fStack_758;
              local_660[3] = (fVar162 + auVar110._12_4_) * fStack_754;
              fStack_650 = (fVar162 + auVar110._16_4_) * fStack_750;
              fStack_64c = (fVar162 + auVar110._20_4_) * fStack_74c;
              fStack_648 = (fVar162 + auVar110._24_4_) * fStack_748;
              fStack_644 = fVar162 + auVar110._28_4_;
              local_5c0._0_8_ = local_700._0_8_;
              local_5c0._8_8_ = local_700._8_8_;
              local_5c0._16_8_ = local_700._16_8_;
              local_5c0._24_8_ = local_700._24_8_;
              local_640 = local_5c0._0_8_;
              uStack_638 = local_5c0._8_8_;
              uStack_630 = local_5c0._16_8_;
              uStack_628 = local_5c0._24_8_;
              local_620 = local_820;
              local_8c0 = local_770._0_4_;
              fStack_8bc = local_770._4_4_;
              fStack_8b8 = local_770._8_4_;
              fStack_8b4 = local_770._12_4_;
              uVar78 = 0;
              local_930 = (ulong)local_670;
              for (uVar80 = local_930; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000)
              {
                uVar78 = uVar78 + 1;
              }
              local_950 = local_780;
              local_550 = local_790._0_8_;
              uStack_548 = local_790._8_8_;
              uVar80 = 0x2227201;
              local_8a8 = lVar82;
              local_720 = local_800;
              local_6e0 = local_820;
              local_6bc = iVar10;
              local_6b0 = auVar20;
              local_5c0 = auVar99;
              do {
                local_940 = *(undefined4 *)(ray + k * 4 + 0x200);
                local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar78]));
                local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)&local_640 + uVar78 * 4)));
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar78 * 4);
                local_9b0.context = context->user;
                fVar168 = local_200._0_4_;
                fVar140 = 1.0 - fVar168;
                fVar162 = fVar140 * fVar140 * -3.0;
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar140 * fVar140)),
                                          ZEXT416((uint)(fVar168 * fVar140)),ZEXT416(0xc0000000));
                auVar89 = vfmsub132ss_fma(ZEXT416((uint)(fVar168 * fVar140)),
                                          ZEXT416((uint)(fVar168 * fVar168)),ZEXT416(0x40000000));
                fVar140 = auVar90._0_4_ * 3.0;
                fVar167 = auVar89._0_4_ * 3.0;
                fVar168 = fVar168 * fVar168 * 3.0;
                auVar171._0_4_ = fVar168 * (float)local_550;
                auVar171._4_4_ = fVar168 * local_550._4_4_;
                auVar171._8_4_ = fVar168 * (float)uStack_548;
                auVar171._12_4_ = fVar168 * uStack_548._4_4_;
                auVar145._4_4_ = fVar167;
                auVar145._0_4_ = fVar167;
                auVar145._8_4_ = fVar167;
                auVar145._12_4_ = fVar167;
                auVar90 = vfmadd132ps_fma(auVar145,auVar171,local_950);
                auVar158._4_4_ = fVar140;
                auVar158._0_4_ = fVar140;
                auVar158._8_4_ = fVar140;
                auVar158._12_4_ = fVar140;
                auVar73._4_4_ = fStack_8bc;
                auVar73._0_4_ = local_8c0;
                auVar73._8_4_ = fStack_8b8;
                auVar73._12_4_ = fStack_8b4;
                auVar90 = vfmadd132ps_fma(auVar158,auVar90,auVar73);
                auVar146._4_4_ = fVar162;
                auVar146._0_4_ = fVar162;
                auVar146._8_4_ = fVar162;
                auVar146._12_4_ = fVar162;
                auVar90 = vfmadd213ps_fma(auVar146,auVar20,auVar90);
                auVar152 = vbroadcastss_avx512f(auVar90);
                auVar175 = vbroadcastss_avx512f(ZEXT416(1));
                local_280 = vpermps_avx512f(auVar175,ZEXT1664(auVar90));
                auVar175 = vbroadcastss_avx512f(ZEXT416(2));
                local_240 = vpermps_avx512f(auVar175,ZEXT1664(auVar90));
                local_2c0[0] = (RTCHitN)auVar152[0];
                local_2c0[1] = (RTCHitN)auVar152[1];
                local_2c0[2] = (RTCHitN)auVar152[2];
                local_2c0[3] = (RTCHitN)auVar152[3];
                local_2c0[4] = (RTCHitN)auVar152[4];
                local_2c0[5] = (RTCHitN)auVar152[5];
                local_2c0[6] = (RTCHitN)auVar152[6];
                local_2c0[7] = (RTCHitN)auVar152[7];
                local_2c0[8] = (RTCHitN)auVar152[8];
                local_2c0[9] = (RTCHitN)auVar152[9];
                local_2c0[10] = (RTCHitN)auVar152[10];
                local_2c0[0xb] = (RTCHitN)auVar152[0xb];
                local_2c0[0xc] = (RTCHitN)auVar152[0xc];
                local_2c0[0xd] = (RTCHitN)auVar152[0xd];
                local_2c0[0xe] = (RTCHitN)auVar152[0xe];
                local_2c0[0xf] = (RTCHitN)auVar152[0xf];
                local_2c0[0x10] = (RTCHitN)auVar152[0x10];
                local_2c0[0x11] = (RTCHitN)auVar152[0x11];
                local_2c0[0x12] = (RTCHitN)auVar152[0x12];
                local_2c0[0x13] = (RTCHitN)auVar152[0x13];
                local_2c0[0x14] = (RTCHitN)auVar152[0x14];
                local_2c0[0x15] = (RTCHitN)auVar152[0x15];
                local_2c0[0x16] = (RTCHitN)auVar152[0x16];
                local_2c0[0x17] = (RTCHitN)auVar152[0x17];
                local_2c0[0x18] = (RTCHitN)auVar152[0x18];
                local_2c0[0x19] = (RTCHitN)auVar152[0x19];
                local_2c0[0x1a] = (RTCHitN)auVar152[0x1a];
                local_2c0[0x1b] = (RTCHitN)auVar152[0x1b];
                local_2c0[0x1c] = (RTCHitN)auVar152[0x1c];
                local_2c0[0x1d] = (RTCHitN)auVar152[0x1d];
                local_2c0[0x1e] = (RTCHitN)auVar152[0x1e];
                local_2c0[0x1f] = (RTCHitN)auVar152[0x1f];
                local_2c0[0x20] = (RTCHitN)auVar152[0x20];
                local_2c0[0x21] = (RTCHitN)auVar152[0x21];
                local_2c0[0x22] = (RTCHitN)auVar152[0x22];
                local_2c0[0x23] = (RTCHitN)auVar152[0x23];
                local_2c0[0x24] = (RTCHitN)auVar152[0x24];
                local_2c0[0x25] = (RTCHitN)auVar152[0x25];
                local_2c0[0x26] = (RTCHitN)auVar152[0x26];
                local_2c0[0x27] = (RTCHitN)auVar152[0x27];
                local_2c0[0x28] = (RTCHitN)auVar152[0x28];
                local_2c0[0x29] = (RTCHitN)auVar152[0x29];
                local_2c0[0x2a] = (RTCHitN)auVar152[0x2a];
                local_2c0[0x2b] = (RTCHitN)auVar152[0x2b];
                local_2c0[0x2c] = (RTCHitN)auVar152[0x2c];
                local_2c0[0x2d] = (RTCHitN)auVar152[0x2d];
                local_2c0[0x2e] = (RTCHitN)auVar152[0x2e];
                local_2c0[0x2f] = (RTCHitN)auVar152[0x2f];
                local_2c0[0x30] = (RTCHitN)auVar152[0x30];
                local_2c0[0x31] = (RTCHitN)auVar152[0x31];
                local_2c0[0x32] = (RTCHitN)auVar152[0x32];
                local_2c0[0x33] = (RTCHitN)auVar152[0x33];
                local_2c0[0x34] = (RTCHitN)auVar152[0x34];
                local_2c0[0x35] = (RTCHitN)auVar152[0x35];
                local_2c0[0x36] = (RTCHitN)auVar152[0x36];
                local_2c0[0x37] = (RTCHitN)auVar152[0x37];
                local_2c0[0x38] = (RTCHitN)auVar152[0x38];
                local_2c0[0x39] = (RTCHitN)auVar152[0x39];
                local_2c0[0x3a] = (RTCHitN)auVar152[0x3a];
                local_2c0[0x3b] = (RTCHitN)auVar152[0x3b];
                local_2c0[0x3c] = (RTCHitN)auVar152[0x3c];
                local_2c0[0x3d] = (RTCHitN)auVar152[0x3d];
                local_2c0[0x3e] = (RTCHitN)auVar152[0x3e];
                local_2c0[0x3f] = (RTCHitN)auVar152[0x3f];
                local_180 = local_480._0_8_;
                uStack_178 = local_480._8_8_;
                uStack_170 = local_480._16_8_;
                uStack_168 = local_480._24_8_;
                uStack_160 = local_480._32_8_;
                uStack_158 = local_480._40_8_;
                uStack_150 = local_480._48_8_;
                uStack_148 = local_480._56_8_;
                auVar152 = vmovdqa64_avx512f(local_4c0);
                local_140 = vmovdqa64_avx512f(auVar152);
                vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                local_100 = vbroadcastss_avx512f(ZEXT416((local_9b0.context)->instID[0]));
                local_c0 = vbroadcastss_avx512f(ZEXT416((local_9b0.context)->instPrimID[0]));
                local_600 = local_300;
                local_9b0.valid = (int *)local_600;
                local_9b0.geometryUserPtr = *(void **)((long)local_980 + 0x18);
                local_9b0.hit = local_2c0;
                local_9b0.N = 0x10;
                local_500._0_4_ = (int)uVar80;
                local_540._0_8_ = uVar78;
                uVar79 = uVar78;
                local_9b0.ray = (RTCRayN *)ray;
                if (*(code **)((long)local_980 + 0x48) != (code *)0x0) {
                  (**(code **)((long)local_980 + 0x48))(&local_9b0);
                  uVar80 = (ulong)(uint)local_500._0_4_;
                  uVar79 = local_540._0_8_;
                }
                auVar152 = vmovdqa64_avx512f(local_600);
                uVar142 = vptestmd_avx512f(auVar152,auVar152);
                if ((short)uVar142 != 0) {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_980 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_9b0);
                    uVar80 = (ulong)(uint)local_500._0_4_;
                    uVar79 = local_540._0_8_;
                  }
                  auVar90 = auVar193._0_16_;
                  auVar152 = vmovdqa64_avx512f(local_600);
                  uVar78 = vptestmd_avx512f(auVar152,auVar152);
                  auVar152 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar78 & 1);
                  auVar175._0_4_ =
                       (uint)bVar13 * auVar152._0_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x200);
                  bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                  auVar175._4_4_ =
                       (uint)bVar13 * auVar152._4_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x204);
                  bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                  auVar175._8_4_ =
                       (uint)bVar13 * auVar152._8_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x208);
                  bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
                  auVar175._12_4_ =
                       (uint)bVar13 * auVar152._12_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x20c);
                  bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
                  auVar175._16_4_ =
                       (uint)bVar13 * auVar152._16_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x210);
                  bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                  auVar175._20_4_ =
                       (uint)bVar13 * auVar152._20_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x214);
                  bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
                  auVar175._24_4_ =
                       (uint)bVar13 * auVar152._24_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x218);
                  bVar13 = (bool)((byte)(uVar78 >> 7) & 1);
                  auVar175._28_4_ =
                       (uint)bVar13 * auVar152._28_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x21c);
                  bVar13 = (bool)((byte)(uVar78 >> 8) & 1);
                  auVar175._32_4_ =
                       (uint)bVar13 * auVar152._32_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x220);
                  bVar13 = (bool)((byte)(uVar78 >> 9) & 1);
                  auVar175._36_4_ =
                       (uint)bVar13 * auVar152._36_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x224);
                  bVar13 = (bool)((byte)(uVar78 >> 10) & 1);
                  auVar175._40_4_ =
                       (uint)bVar13 * auVar152._40_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x228);
                  bVar13 = (bool)((byte)(uVar78 >> 0xb) & 1);
                  auVar175._44_4_ =
                       (uint)bVar13 * auVar152._44_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x22c);
                  bVar13 = (bool)((byte)(uVar78 >> 0xc) & 1);
                  auVar175._48_4_ =
                       (uint)bVar13 * auVar152._48_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x230);
                  bVar13 = (bool)((byte)(uVar78 >> 0xd) & 1);
                  auVar175._52_4_ =
                       (uint)bVar13 * auVar152._52_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x234);
                  bVar13 = (bool)((byte)(uVar78 >> 0xe) & 1);
                  auVar175._56_4_ =
                       (uint)bVar13 * auVar152._56_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x238);
                  bVar13 = SUB81(uVar78 >> 0xf,0);
                  auVar175._60_4_ =
                       (uint)bVar13 * auVar152._60_4_ |
                       (uint)!bVar13 * *(int *)(local_9b0.ray + 0x23c);
                  *(undefined1 (*) [64])(local_9b0.ray + 0x200) = auVar175;
                  if ((short)uVar78 != 0) break;
                }
                auVar90 = auVar193._0_16_;
                *(undefined4 *)(ray + k * 4 + 0x200) = local_940;
                uVar78 = 0;
                local_930 = local_930 ^ 1L << (uVar79 & 0x3f);
                for (uVar79 = local_930; (uVar79 & 1) == 0;
                    uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                  uVar78 = uVar78 + 1;
                }
                uVar80 = CONCAT71((int7)(uVar80 >> 8),local_930 != 0);
              } while (local_930 != 0);
              bVar81 = (byte)uVar80 & 1;
              auVar90 = vxorps_avx512vl(auVar90,auVar90);
              auVar193 = ZEXT1664(auVar90);
              in_ZMM20 = ZEXT3264(local_800);
              in_ZMM21 = ZEXT3264(local_820);
              auVar192 = ZEXT3264(local_7c0);
              auVar186 = ZEXT3264(local_7e0);
              auVar190 = ZEXT3264(local_900);
              auVar150 = ZEXT3264(local_860);
              auVar194 = ZEXT3264(local_880);
              lVar82 = local_8a8;
            }
            uVar77 = CONCAT31(local_920._1_3_,local_920[0] | bVar81);
          }
          auVar175 = ZEXT3264(auVar98);
          auVar152 = ZEXT3264(auVar100);
          uVar78 = (ulong)uVar77;
          lVar82 = lVar82 + 8;
          auVar191 = auVar186;
        } while ((int)lVar82 < iVar10);
      }
      if ((uVar78 & 1) != 0) {
        return bVar85;
      }
      uVar141 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar26._4_4_ = uVar141;
      auVar26._0_4_ = uVar141;
      auVar26._8_4_ = uVar141;
      auVar26._12_4_ = uVar141;
      auVar26._16_4_ = uVar141;
      auVar26._20_4_ = uVar141;
      auVar26._24_4_ = uVar141;
      auVar26._28_4_ = uVar141;
      uVar142 = vcmpps_avx512vl(local_320,auVar26,2);
      uVar83 = (uint)uVar84 & (uint)uVar142;
      uVar84 = (ulong)uVar83;
      bVar85 = uVar83 != 0;
    } while (bVar85);
  }
  return bVar85;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }